

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O1

void mbedtls_strerror(int ret,char *buf,size_t buflen)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  if (buflen == 0) {
    return;
  }
  memset(buf,0,buflen);
  uVar4 = -ret;
  if (0 < ret) {
    uVar4 = ret;
  }
  uVar3 = uVar4 & 0xff80;
  if (uVar3 < 0x3b80) {
    if (0x30ff < uVar3) {
      if (0x34ff < uVar3) {
        if (uVar3 < 0x3980) {
          if (uVar3 < 0x3880) {
            if (uVar3 == 0x3500) {
LAB_0011b686:
              snprintf(buf,buflen,"DHM - DHM hardware accelerator failed");
              if (0x4e7f < uVar3) {
                if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
                goto LAB_0011b710;
              }
              if (uVar3 != 0x3580) {
                if (uVar3 == 0x4d80) goto switchD_0011b75c_caseD_2;
                if (uVar3 == 0x4e00) goto switchD_0011b75c_caseD_3;
                goto LAB_0011bc47;
              }
            }
            else if (uVar3 != 0x3580) goto LAB_0011e269;
LAB_0011b6cb:
            snprintf(buf,buflen,"DHM - Setting the modulus and generator failed");
            switch(uVar3 - 0x4d00 >> 7) {
            case 0:
              goto switchD_0011b75c_caseD_1;
            case 1:
              goto switchD_0011b75c_caseD_2;
            case 2:
              goto switchD_0011b75c_caseD_3;
            case 3:
switchD_0011b75c_caseD_4:
              snprintf(buf,buflen,
                       "ECP - The requested feature is not available, for example, the requested curve is not supported"
                      );
              break;
            case 4:
switchD_0011b75c_caseD_5:
              snprintf(buf,buflen,"ECP - The buffer is too small to write to");
              goto LAB_0011b772;
            case 5:
switchD_0011b701_caseD_5:
              snprintf(buf,buflen,"ECP - Bad input parameters to function");
              switch(uVar3 - 0x4c80 >> 7) {
              case 0:
                goto switchD_0011b75c_caseD_0;
              case 1:
                goto switchD_0011b75c_caseD_1;
              case 2:
                goto switchD_0011b75c_caseD_2;
              case 3:
                goto switchD_0011b75c_caseD_3;
              case 4:
                goto switchD_0011b75c_caseD_4;
              case 5:
                goto switchD_0011b75c_caseD_5;
              default:
                goto switchD_0011b75c_default;
              }
            default:
              goto switchD_0011b701_default;
            }
            goto LAB_0011b7d5;
          }
          if (uVar3 != 0x3880) {
            if (uVar3 != 0x3900) goto LAB_0011e269;
            goto switchD_0011dbad_caseD_0;
          }
switchD_0011d89b_caseD_35:
          snprintf(buf,buflen,"PK - PK hardware accelerator failed");
LAB_0011df8c:
          if (0x40ff < uVar3) {
LAB_0011df95:
            if (uVar3 < 0x4380) {
              if (0x41ff < uVar3) {
                if (uVar3 == 0x4200) goto switchD_0011e522_caseD_0;
LAB_0011e1dc:
                if (uVar3 != 0x4280) {
                  if (uVar3 == 0x4300) goto switchD_0011e55a_caseD_1;
                  goto switchD_0011e522_default;
                }
                goto switchD_0011e55a_caseD_0;
              }
              goto LAB_0011e213;
            }
LAB_0011e07e:
            if (uVar3 < 0x4480) goto LAB_0011e42e;
            goto LAB_0011e44d;
          }
          if (uVar3 < 0x2e00) {
            if (0x1eff < uVar3) {
LAB_0011dff6:
              if (uVar3 != 0x1f00) {
                if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
                goto switchD_0011e522_default;
              }
              goto switchD_0011d89b_caseD_2;
            }
LAB_0011e0a6:
            if (uVar3 != 0x1e00) {
              if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
              goto switchD_0011e522_default;
            }
            goto switchD_0011d89b_caseD_0;
          }
          if (uVar3 < 0x2f00) goto LAB_0011e0c1;
          if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
LAB_0011e204:
          if (uVar3 == 0x2f80) {
switchD_0011d89b_caseD_23:
            snprintf(buf,buflen,"PKCS5 - Bad input parameters to function");
            goto LAB_0011e269;
          }
LAB_0011e344:
          if (uVar3 == 0x4080) goto switchD_0011d89b_caseD_45;
        }
        else {
          if (0x3a7f < uVar3) {
            if (uVar3 != 0x3a80) {
              if (uVar3 != 0x3b00) goto LAB_0011e269;
              goto switchD_0011dbad_caseD_4;
            }
switchD_0011dbad_caseD_3:
            snprintf(buf,buflen,"PK - The algorithm tag or value is invalid");
            if (uVar3 < 0x3900) {
              if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
              if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
              if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
            }
            else {
              if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
              if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
              if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
            }
            goto LAB_0011e068;
          }
          if (uVar3 != 0x3980) {
            if (uVar3 != 0x3a00) goto LAB_0011e269;
            goto switchD_0011dbad_caseD_2;
          }
switchD_0011dbad_caseD_1:
          snprintf(buf,buflen,"PK - Unavailable feature, e.g. RSA disabled for RSA key");
          if (uVar3 < 0x1f80) {
            if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
            if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
          }
          else {
            if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
          }
LAB_0011e10a:
          if (0x41ff < uVar3) {
LAB_0011e148:
            if (0x43ff < uVar3) goto LAB_0011e2da;
            if (0x42ff < uVar3) goto LAB_0011e306;
            goto LAB_0011e475;
          }
          if (0x2f7f < uVar3) {
            if (uVar3 < 0x4100) goto LAB_0011e204;
LAB_0011e213:
            if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
            if (uVar3 != 0x4180) goto switchD_0011e522_default;
            goto switchD_0011e416_caseD_1;
          }
          if (0x2e7f < uVar3) goto LAB_0011e29a;
          if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
LAB_0011e136:
          if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
        }
        goto switchD_0011e522_default;
      }
      if (0x32ff < uVar3) {
        if (0x33ff < uVar3) {
          if (uVar3 == 0x3400) {
LAB_0011b591:
            snprintf(buf,buflen,"DHM - Allocation of memory failed");
            if (0x4dff < uVar3) {
LAB_0011b5ae:
              if (uVar3 < 0x4f00) {
                if (uVar3 == 0x4e00) goto switchD_0011b75c_caseD_3;
                if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
              }
              else {
                if (uVar3 == 0x4f00) goto switchD_0011b75c_caseD_5;
                if (uVar3 == 0x4f80) goto switchD_0011b701_caseD_5;
              }
              goto LAB_0011ba84;
            }
            if (uVar3 != 0x3480) {
LAB_0011b5fe:
              if (uVar3 == 0x3500) goto LAB_0011b686;
              if (uVar3 != 0x3580) goto LAB_0011ba84;
              goto LAB_0011b6cb;
            }
          }
          else if (uVar3 != 0x3480) goto LAB_0011e269;
LAB_0011b619:
          snprintf(buf,buflen,"DHM - Read or write of file failed");
          if (uVar3 < 0x4e00) {
            if (uVar3 == 0x3500) goto LAB_0011b686;
            if (uVar3 == 0x3580) goto LAB_0011b6cb;
            if (uVar3 == 0x4d80) goto switchD_0011b75c_caseD_2;
          }
          else if (uVar3 < 0x4f00) {
            if (uVar3 == 0x4e00) goto switchD_0011b75c_caseD_3;
            if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
          }
          else {
LAB_0011b710:
            if (uVar3 == 0x4f00) goto switchD_0011b75c_caseD_5;
            if (uVar3 == 0x4f80) goto switchD_0011b701_caseD_5;
          }
          goto LAB_0011bc47;
        }
        if (uVar3 != 0x3300) {
          if (uVar3 != 0x3380) goto LAB_0011e269;
LAB_0011b54c:
          snprintf(buf,buflen,"DHM - The ASN.1 data is not formatted correctly");
          if (0x4dff < uVar3) goto LAB_0011b5ae;
          if (0x34ff < uVar3) goto LAB_0011b5fe;
          if (uVar3 == 0x3400) goto LAB_0011b591;
          if (uVar3 != 0x3480) goto LAB_0011ba84;
          goto LAB_0011b619;
        }
LAB_0011b450:
        snprintf(buf,buflen,"DHM - Calculation of the DHM secret failed");
        if (0x357f < uVar3) goto LAB_0011b495;
        if (uVar3 < 0x3480) {
          if (uVar3 == 0x3380) goto LAB_0011b54c;
          if (uVar3 == 0x3400) goto LAB_0011b591;
        }
        else {
          if (uVar3 == 0x3480) goto LAB_0011b619;
          if (uVar3 == 0x3500) goto LAB_0011b686;
        }
LAB_0011b7d5:
        if (uVar3 < 0x3f80) {
          if (uVar3 < 0x1380) {
            if (uVar3 < 0x1200) {
              if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
              if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
              if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
            }
            else {
              if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
              if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
              if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
            }
          }
          else if (uVar3 < 0x3e00) {
            if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
            if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
            if (uVar3 == 0x1480) goto LAB_0011d5c6;
          }
          else {
            if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
            if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
            if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          }
        }
        else if (uVar3 < 0x4d80) {
          if (uVar3 < 0x4c00) {
            if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
            if (uVar3 == 0x4b00) goto LAB_0011c45b;
            if (uVar3 == 0x4b80) goto LAB_0011c3a8;
          }
          else {
            if (uVar3 == 0x4c00) goto LAB_0011c357;
            if (uVar3 == 0x4c80) goto switchD_0011b75c_caseD_0;
            if (uVar3 == 0x4d00) goto switchD_0011b75c_caseD_1;
          }
        }
        else if (uVar3 < 0x5100) {
          if (uVar3 == 0x4d80) goto switchD_0011b75c_caseD_2;
          if (uVar3 == 0x4e00) {
switchD_0011b75c_caseD_3:
            snprintf(buf,buflen,"ECP - The signature is not valid");
            goto LAB_0011ba84;
          }
          if (uVar3 == 0x5080) goto LAB_0011c51a;
        }
        else if (uVar3 < 0x5200) {
          if (uVar3 == 0x5100) goto LAB_0011c600;
          if (uVar3 == 0x5180) goto LAB_0011c670;
        }
        else {
          if (uVar3 == 0x5200) goto LAB_0011c8bf;
          if (uVar3 == 0x5280) goto LAB_0011c946;
        }
LAB_0011d975:
        if (0x3bff < uVar3) {
          if (0x41ff < uVar3) goto LAB_0011e148;
          if (uVar3 < 0x3d80) {
LAB_0011d9d8:
            if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
LAB_0011d9e5:
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
            if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
            goto switchD_0011e522_default;
          }
          if (0x40ff < uVar3) goto LAB_0011e213;
          if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
          goto LAB_0011e344;
        }
        if (0x2f7f < uVar3) {
          if (0x39ff < uVar3) {
            if (0x3aff < uVar3) goto LAB_0011da11;
            goto LAB_0011ddaa;
          }
LAB_0011d994:
          if (0x38ff < uVar3) {
LAB_0011dc2d:
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
            if (uVar3 != 0x3980) goto switchD_0011e522_default;
            goto switchD_0011dbad_caseD_1;
          }
LAB_0011dd21:
          if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
          if (uVar3 != 0x3880) goto switchD_0011e522_default;
          goto switchD_0011d89b_caseD_35;
        }
LAB_0011dabd:
        if (uVar3 < 0x1f80) goto LAB_0011dcb3;
        if (uVar3 < 0x2e80) {
LAB_0011df20:
          if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
          goto LAB_0011e136;
        }
LAB_0011e29a:
        if (uVar3 != 0x2e80) {
          if (uVar3 != 0x2f00) goto switchD_0011e522_default;
switchD_0011d89b_caseD_22:
          snprintf(buf,buflen,"PKCS5 - Unexpected ASN.1 data");
LAB_0011e2c8:
          if (0x427f < uVar3) goto LAB_0011e2d1;
          if (0x40ff < uVar3) goto LAB_0011e494;
          if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
          if (uVar3 != 0x2e80) goto LAB_0011e344;
        }
switchD_0011d89b_caseD_21:
        snprintf(buf,buflen,"PKCS5 - Requested encryption or digest alg not available");
LAB_0011e36a:
        if (0x42ff < uVar3) goto LAB_0011e418;
        if (0x417f < uVar3) goto LAB_0011e46c;
        if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
        goto LAB_0011e38d;
      }
      if (uVar3 < 0x3200) {
        if (uVar3 == 0x3100) {
          snprintf(buf,buflen,"DHM - Reading of the DHM parameters failed");
LAB_0011b32b:
          if (uVar3 == 0x3180) goto LAB_00119ba7;
          if (uVar3 == 0x3200) goto LAB_0011b3b8;
        }
        else {
          if (uVar3 != 0x3180) goto LAB_0011e269;
LAB_00119ba7:
          snprintf(buf,buflen,"DHM - Making of the DHM parameters failed");
          if (0x347f < uVar3) goto LAB_0011b3d5;
          if (0x32ff < uVar3) {
            if (uVar3 == 0x3300) goto LAB_0011b450;
            goto LAB_0011b4fb;
          }
          if (uVar3 == 0x3200) goto LAB_0011b3b8;
          if (uVar3 == 0x3280) goto LAB_00119f9a;
        }
      }
      else {
        if (uVar3 != 0x3200) {
          if (uVar3 != 0x3280) goto LAB_0011e269;
LAB_00119f9a:
          snprintf(buf,buflen,"DHM - Making of the public value failed");
          if (uVar3 < 0x3500) {
            if (uVar3 < 0x3400) {
              if (uVar3 == 0x3300) goto LAB_0011b450;
              if (uVar3 == 0x3380) goto LAB_0011b54c;
            }
            else {
              if (uVar3 == 0x3400) goto LAB_0011b591;
              if (uVar3 == 0x3480) goto LAB_0011b619;
            }
          }
          else {
            if (0x4e7f < uVar3) {
              if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
              goto LAB_0011b4bd;
            }
            if (uVar3 == 0x3500) goto LAB_0011b686;
            if (uVar3 == 0x3580) goto LAB_0011b6cb;
          }
          goto LAB_0011b7d5;
        }
LAB_0011b3b8:
        snprintf(buf,buflen,"DHM - Reading of the public values failed");
        if (uVar3 < 0x3480) {
          if (uVar3 < 0x3380) {
            if (uVar3 == 0x3280) goto LAB_00119f9a;
            if (uVar3 == 0x3300) goto LAB_0011b450;
          }
          else {
LAB_0011b4fb:
            if (uVar3 == 0x3380) goto LAB_0011b54c;
            if (uVar3 == 0x3400) goto LAB_0011b591;
          }
        }
        else {
LAB_0011b3d5:
          if (uVar3 < 0x3580) {
            if (uVar3 == 0x3480) goto LAB_0011b619;
            if (uVar3 == 0x3500) goto LAB_0011b686;
          }
          else {
            if (uVar3 == 0x3580) goto LAB_0011b6cb;
            if (uVar3 == 0x4f00) goto switchD_0011b75c_caseD_5;
            if (uVar3 == 0x4f80) goto switchD_0011b701_caseD_5;
          }
        }
      }
LAB_0011b772:
      if (uVar3 < 0x4c00) {
        if (uVar3 < 0x1300) {
          if (uVar3 < 0x1180) {
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          }
          else {
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
            if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
            if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          }
        }
        else if (uVar3 < 0x1400) {
          if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
          if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
        }
        else {
          if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
          if (uVar3 == 0x4b00) goto LAB_0011c45b;
          if (uVar3 == 0x4b80) goto LAB_0011c3a8;
        }
      }
      else if (uVar3 < 0x4e80) {
        if (uVar3 < 0x4d00) {
          if (uVar3 == 0x4c00) goto LAB_0011c357;
          if (uVar3 == 0x4c80) goto switchD_0011b75c_caseD_0;
        }
        else {
          if (uVar3 == 0x4d00) goto switchD_0011b75c_caseD_1;
          if (uVar3 == 0x4d80) goto switchD_0011b75c_caseD_2;
          if (uVar3 == 0x4e00) goto switchD_0011b75c_caseD_3;
        }
      }
      else if (uVar3 < 0x5180) {
        if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
        if (uVar3 == 0x5080) goto LAB_0011c51a;
        if (uVar3 == 0x5100) goto LAB_0011c600;
      }
      else {
        if (uVar3 == 0x5180) goto LAB_0011c670;
        if (uVar3 == 0x5200) goto LAB_0011c8bf;
        if (uVar3 == 0x5280) goto LAB_0011c946;
      }
switchD_0011cc10_default:
      if (uVar3 < 0x3c00) {
        if (uVar3 < 0x2f80) {
          if (uVar3 < 0x1f80) {
            if (uVar3 < 0x1e80) {
              if (uVar3 == 0x1480) goto LAB_0011d5c6;
              if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
            }
            else {
              if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
              if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
            }
          }
          else if (uVar3 < 0x2e80) {
            if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
            if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
          }
          else {
            if (uVar3 == 0x2e80) goto switchD_0011d89b_caseD_21;
            if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
          }
        }
        else if (uVar3 < 0x3a00) {
          if (uVar3 < 0x3900) {
            if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
          }
          else {
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
            if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
          }
        }
        else if (uVar3 < 0x3b00) {
          if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
        }
        else {
          if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
          if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
        }
      }
      else if (uVar3 < 0x4080) {
        if (uVar3 < 0x3e00) {
          if (uVar3 < 0x3d00) {
            if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
          }
          else {
            if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
            if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
          }
        }
        else if (uVar3 < 0x3f00) {
          if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        }
        else {
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
        }
      }
      else if (uVar3 < 0x4280) {
        if (uVar3 < 0x4180) {
          if (uVar3 == 0x4080) goto switchD_0011d89b_caseD_45;
          if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
        }
        else {
          if (uVar3 == 0x4180) goto switchD_0011e416_caseD_1;
          if (uVar3 == 0x4200) goto switchD_0011e522_caseD_0;
        }
      }
      else if (uVar3 < 0x4380) {
        if (uVar3 == 0x4280) goto switchD_0011e55a_caseD_0;
        if (uVar3 == 0x4300) goto switchD_0011e55a_caseD_1;
      }
      else {
        if (uVar3 == 0x4380) goto switchD_0011e55a_caseD_2;
        if (uVar3 == 0x4400) goto switchD_0011e55a_caseD_3;
      }
LAB_0011e618:
      if (uVar3 == 0x4580) goto switchD_0011e522_caseD_7;
      if (uVar3 != 0x4500) {
LAB_0011e62a:
        if (uVar3 == 0x4480) goto switchD_0011e55a_caseD_4;
        goto switchD_0011e522_default;
      }
switchD_0011e522_caseD_6:
      snprintf(buf,buflen,
               "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality"
              );
      goto switchD_0011d89b_caseD_4;
    }
    if (uVar3 < 0x1400) {
      if (0x11ff < uVar3) {
        if (uVar3 < 0x1300) {
          if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
          if (uVar3 != 0x1280) goto LAB_0011e269;
switchD_0011cc10_caseD_2:
          snprintf(buf,buflen,"PEM - Unsupported key encryption algorithm");
          goto LAB_0011ccce;
        }
        if (uVar3 == 0x1300) {
switchD_0011cc10_caseD_3:
          snprintf(buf,buflen,"PEM - Private key password can\'t be empty");
          goto LAB_0011d13c;
        }
        if (uVar3 != 0x1380) goto LAB_0011e269;
switchD_0011cc10_caseD_4:
        snprintf(buf,buflen,"PEM - Given private key password does not allow for correct decryption"
                );
switchD_0011c97c_default:
        if (uVar3 < 0x3c80) {
          if (0x2f7f < uVar3) {
            if (uVar3 < 0x3a00) goto LAB_0011d994;
            if (uVar3 < 0x3b00) goto LAB_0011ddaa;
LAB_0011db54:
            if (uVar3 != 0x3b00) {
              if (uVar3 != 0x3b80) {
                if (uVar3 != 0x3c00) goto switchD_0011e522_default;
                goto switchD_0011d95f_caseD_2;
              }
              goto switchD_0011dbad_caseD_5;
            }
            goto switchD_0011dbad_caseD_4;
          }
          if (uVar3 < 0x1f00) {
            if (uVar3 < 0x1e00) {
              if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
              if (uVar3 == 0x1480) goto LAB_0011d5c6;
              goto switchD_0011e522_default;
            }
            goto LAB_0011e0a6;
          }
LAB_0011d1c2:
          if (uVar3 < 0x2e00) goto LAB_0011dff6;
          goto LAB_0011e28d;
        }
        if (0x417f < uVar3) goto LAB_0011e071;
        if (uVar3 < 16000) {
          if (0x3d7f < uVar3) {
LAB_0011d58c:
            if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
            if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
            goto switchD_0011e522_default;
          }
          goto LAB_0011d9e5;
        }
        if (uVar3 < 0x3f80) {
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          goto switchD_0011e522_default;
        }
        if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
LAB_0011e38d:
        if (uVar3 == 0x4080) {
switchD_0011d89b_caseD_45:
          snprintf(buf,buflen,"RSA - Bad input parameters to function");
LAB_0011e3f4:
          switch(uVar3 - 0x4100 >> 7) {
          case 0:
            goto switchD_0011e416_caseD_0;
          case 1:
            goto switchD_0011e416_caseD_1;
          case 2:
            goto switchD_0011e522_caseD_0;
          case 3:
            goto switchD_0011e55a_caseD_0;
          case 4:
            goto switchD_0011e55a_caseD_1;
          case 5:
            goto switchD_0011e55a_caseD_2;
          case 6:
            goto switchD_0011e55a_caseD_3;
          case 7:
            goto switchD_0011e55a_caseD_4;
          case 8:
            goto switchD_0011e522_caseD_6;
          case 9:
            goto switchD_0011e522_caseD_7;
          }
        }
        else if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
        goto switchD_0011e522_default;
      }
      if (0x10ff < uVar3) {
        if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
        if (uVar3 != 0x1180) goto LAB_0011e269;
        goto switchD_0011cc10_caseD_0;
      }
      if (uVar3 != 0) {
        if (uVar3 != 0x1080) goto LAB_0011e269;
        goto switchD_0011c97c_caseD_0;
      }
    }
    else {
      if (uVar3 < 0x1f00) {
        if (uVar3 < 0x1e00) {
          if (uVar3 == 0x1400) {
switchD_0011cc10_caseD_5:
            snprintf(buf,buflen,"PEM - Unavailable feature, e.g. hashing/encryption combination");
            goto switchD_0011cc10_default;
          }
          if (uVar3 != 0x1480) goto LAB_0011e269;
LAB_0011d5c6:
          snprintf(buf,buflen,"PEM - Bad input parameters to function");
          switch(uVar3 - 0x3c80 >> 7) {
          case 0:
            goto switchD_0011d5fc_caseD_0;
          case 1:
            goto switchD_0011d5fc_caseD_1;
          case 2:
            goto switchD_0011d5fc_caseD_2;
          case 3:
            goto switchD_0011d5fc_caseD_3;
          case 4:
            goto switchD_0011d5fc_caseD_4;
          case 5:
            goto switchD_0011d5fc_caseD_5;
          case 6:
switchD_0011d5fc_caseD_6:
            snprintf(buf,buflen,"PK - Memory allocation failed");
            goto LAB_0011d879;
          }
          goto switchD_0011d5fc_default;
        }
        if (uVar3 != 0x1e00) {
          if (uVar3 != 0x1e80) goto LAB_0011e269;
          goto switchD_0011d89b_caseD_1;
        }
switchD_0011d89b_caseD_0:
        snprintf(buf,buflen,
                 "PKCS12 - Given private key password does not allow for correct decryption");
        if (0x2eff < uVar3) {
          if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
          if (uVar3 != 0x4080) {
            if (uVar3 != 0x2f80) goto LAB_0011e3f4;
            goto switchD_0011d89b_caseD_23;
          }
          goto switchD_0011d89b_caseD_45;
        }
LAB_0011e1b0:
        if (uVar3 != 0x2e00) {
          if (uVar3 == 0x2e80) goto switchD_0011d89b_caseD_21;
          goto LAB_0011e3f4;
        }
      }
      else {
        if (uVar3 < 0x2f80) {
          if (uVar3 != 0x1f00) {
            if (uVar3 != 0x1f80) goto LAB_0011e269;
            goto switchD_0011d89b_caseD_3;
          }
switchD_0011d89b_caseD_2:
          snprintf(buf,buflen,"PKCS12 - Feature not available, e.g. unsupported encryption scheme");
LAB_0011e068:
          if (uVar3 < 0x4180) {
            if (uVar3 < 0x2f00) {
              if (0x2dff < uVar3) goto LAB_0011e0c1;
              goto LAB_0011e0a6;
            }
            if (uVar3 < 0x4080) {
              if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
              if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
              goto switchD_0011e522_default;
            }
            goto LAB_0011e38d;
          }
LAB_0011e071:
          if (0x437f < uVar3) goto LAB_0011e07e;
          if (0x427f < uVar3) goto LAB_0011e1dc;
          goto LAB_0011e49d;
        }
        if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
        if (uVar3 == 0x3080) {
          snprintf(buf,buflen,"DHM - Bad input parameters");
          goto LAB_0011b32b;
        }
LAB_0011e269:
        if (0x427f < uVar3) goto LAB_0011e2d1;
        if (0x407f < uVar3) goto LAB_0011e27b;
LAB_0011e28d:
        if (uVar3 != 0x2e00) goto LAB_0011e29a;
      }
switchD_0011d89b_caseD_20:
      snprintf(buf,buflen,"PKCS5 - Given private key password does not allow for correct decryption"
              );
      uVar1 = uVar3 - 0x4080 >> 7;
      if (uVar1 < 5) {
        (*(code *)(&DAT_00139e28 + *(int *)(&DAT_00139e28 + (ulong)uVar1 * 4)))();
        return;
      }
LAB_0011e570:
      switch(uVar3 - 0x4300 >> 7) {
      case 0:
        goto switchD_0011e55a_caseD_1;
      case 1:
        goto switchD_0011e55a_caseD_2;
      case 2:
        goto switchD_0011e55a_caseD_3;
      case 3:
        goto switchD_0011e55a_caseD_4;
      case 4:
        goto switchD_0011e522_caseD_6;
      case 5:
        goto switchD_0011e522_caseD_7;
      }
switchD_0011e522_default:
      if (*buf == '\0') {
        snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar3);
      }
    }
    uVar4 = uVar4 & 0x7fff007f;
    if (uVar4 == 0) {
      return;
    }
    sVar2 = strlen(buf);
    if (sVar2 != 0) {
      if (buflen - sVar2 < 5) {
        return;
      }
      snprintf(buf + sVar2,buflen - sVar2," : ");
      buf = buf + sVar2 + 3;
      buflen = buflen - (sVar2 + 3);
    }
    uVar3 = uVar4 - 2;
    switch(uVar3) {
    case 0:
switchD_0011e70c_caseD_0:
      snprintf(buf,buflen,"BIGNUM - An error occurred while reading from or writing to a file");
      switch(uVar4) {
      case 4:
        goto switchD_0011e70c_caseD_2;
      case 6:
        goto switchD_0011e70c_caseD_4;
      case 8:
        goto switchD_0011e70c_caseD_6;
      case 10:
        goto switchD_0011e70c_caseD_8;
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      }
      goto switchD_0011ebd9_caseD_1;
    case 1:
    case 3:
    case 5:
    case 7:
    case 9:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x26:
    case 0x27:
    case 0x29:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x33:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x50:
      goto switchD_0011e70c_caseD_1;
    case 2:
switchD_0011e70c_caseD_2:
      snprintf(buf,buflen,"BIGNUM - Bad input parameters to function");
      switch(uVar4) {
      case 6:
        goto switchD_0011e70c_caseD_4;
      case 8:
        goto switchD_0011e70c_caseD_6;
      case 10:
        goto switchD_0011e70c_caseD_8;
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      }
      break;
    case 4:
switchD_0011e70c_caseD_4:
      snprintf(buf,buflen,"BIGNUM - There is an invalid character in the digit string");
      switch(uVar4) {
      case 8:
        goto switchD_0011e70c_caseD_6;
      case 10:
        goto switchD_0011e70c_caseD_8;
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      }
      break;
    case 6:
switchD_0011e70c_caseD_6:
      snprintf(buf,buflen,"BIGNUM - The buffer is too small to write to");
      switch(uVar4) {
      case 10:
        goto switchD_0011e70c_caseD_8;
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      case 0x18:
        goto switchD_0011e70c_caseD_16;
      }
      goto switchD_0011ec9d_caseD_b;
    case 8:
switchD_0011e70c_caseD_8:
      snprintf(buf,buflen,"BIGNUM - The input arguments are negative or result in illegal output");
      switch(uVar4) {
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      case 0x17:
        goto switchD_0011e70c_caseD_15;
      case 0x18:
        goto switchD_0011e70c_caseD_16;
      }
      goto switchD_0011e892_caseD_1;
    case 10:
switchD_0011e70c_caseD_a:
      snprintf(buf,buflen,"BIGNUM - The input argument for division is zero, which is not allowed");
      goto switchD_0011eacd_caseD_1;
    case 0xb:
      goto switchD_0011e70c_caseD_b;
    case 0xc:
      goto switchD_0011e70c_caseD_c;
    case 0xd:
      goto switchD_0011e70c_caseD_d;
    case 0xe:
      goto switchD_0011e70c_caseD_e;
    case 0xf:
      goto switchD_0011e70c_caseD_f;
    case 0x14:
      goto switchD_0011e70c_caseD_14;
    case 0x15:
      goto switchD_0011e70c_caseD_15;
    case 0x16:
      goto switchD_0011e70c_caseD_16;
    case 0x17:
switchD_0011e70c_caseD_17:
      snprintf(buf,buflen,"ARC4 - ARC4 hardware accelerator failed");
      if (uVar4 < 0x2a) {
        switch(uVar3) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 2:
          goto switchD_0011e70c_caseD_2;
        case 4:
          goto switchD_0011e70c_caseD_4;
        case 6:
          goto switchD_0011e70c_caseD_6;
        case 8:
          goto switchD_0011e70c_caseD_8;
        case 10:
          goto switchD_0011e70c_caseD_a;
        case 0xc:
          goto switchD_0011e70c_caseD_c;
        case 0xe:
          goto switchD_0011e70c_caseD_e;
        case 0x14:
          goto switchD_0011e70c_caseD_14;
        }
      }
      else {
        switch(uVar4) {
        case 0x60:
          goto switchD_0011e761_caseD_60;
        case 0x61:
        case 99:
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6b:
          break;
        case 0x62:
          goto switchD_0011e761_caseD_62;
        case 100:
          goto switchD_0011e761_caseD_64;
        case 0x66:
          goto switchD_0011e761_caseD_66;
        case 0x68:
          goto switchD_0011e761_caseD_68;
        case 0x6a:
          goto switchD_0011e761_caseD_6a;
        case 0x6c:
          goto switchD_0011e761_caseD_6c;
        default:
          if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
          if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
        }
      }
      break;
    case 0x1e:
      snprintf(buf,buflen,"AES - Invalid key length");
      switch(uVar4) {
      case 1:
        goto switchD_0011f61e_caseD_1;
      case 2:
        goto switchD_0011e70c_caseD_0;
      case 3:
        goto switchD_0011f972_caseD_3;
      case 4:
        goto switchD_0011e70c_caseD_2;
      case 5:
        goto switchD_0011f972_caseD_5;
      case 6:
        goto switchD_0011e70c_caseD_4;
      case 7:
        goto switchD_0011f972_caseD_7;
      case 8:
        goto switchD_0011e70c_caseD_6;
      case 9:
        goto switchD_0011f972_caseD_9;
      case 10:
        goto switchD_0011e70c_caseD_8;
      case 0xb:
        goto switchD_0011f972_caseD_b;
      case 0xc:
        goto switchD_0011e70c_caseD_a;
      case 0xd:
        goto switchD_0011e70c_caseD_b;
      case 0xe:
        goto switchD_0011e70c_caseD_c;
      case 0xf:
        goto switchD_0011e70c_caseD_d;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x11:
        goto switchD_0011e70c_caseD_f;
      case 0x12:
        goto switchD_0011f972_caseD_12;
      case 0x13:
        goto switchD_0011f972_caseD_13;
      case 0x14:
        goto switchD_0011f972_caseD_14;
      default:
        goto switchD_0011e7ca_caseD_15;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      case 0x17:
        goto switchD_0011e70c_caseD_15;
      case 0x18:
        goto switchD_0011e70c_caseD_16;
      case 0x19:
        goto switchD_0011e70c_caseD_17;
      case 0x21:
        goto switchD_0011e70c_caseD_1f;
      case 0x22:
        goto switchD_0011e70c_caseD_20;
      case 0x23:
        goto switchD_0011e70c_caseD_21;
      case 0x24:
        goto switchD_0011e70c_caseD_22;
      case 0x25:
        goto switchD_0011e70c_caseD_23;
      case 0x26:
        goto switchD_0011e70c_caseD_24;
      case 0x27:
        goto switchD_0011e70c_caseD_25;
      case 0x2a:
        goto switchD_0011e70c_caseD_28;
      case 0x2c:
        goto switchD_0011e70c_caseD_2a;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x32:
        goto switchD_0011f497_caseD_32;
      case 0x33:
        goto switchD_0011f497_caseD_33;
      case 0x34:
        goto switchD_0011e70c_caseD_32;
      case 0x36:
        goto switchD_0011e70c_caseD_34;
      case 0x38:
        goto switchD_0011e70c_caseD_36;
      case 0x3a:
        goto switchD_0011e70c_caseD_38;
      case 0x3c:
        goto switchD_0011f497_caseD_3c;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3e:
        goto switchD_0011f497_caseD_3e;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      case 0x40:
        goto switchD_0011f497_caseD_40;
      case 0x51:
        goto switchD_0011e70c_caseD_4f;
      case 0x53:
        goto switchD_0011e70c_caseD_51;
      case 0x54:
        goto switchD_0011e70c_caseD_52;
      case 0x55:
        goto switchD_0011e70c_caseD_53;
      case 0x56:
        goto switchD_0011e70c_caseD_54;
      case 0x57:
        goto switchD_0011f39a_caseD_57;
      case 0x60:
switchD_0011e761_caseD_60:
        snprintf(buf,buflen,"ASN1 - Out of data when parsing an ASN1 data structure");
        if (uVar4 < 0x2a) {
          switch(uVar3) {
          case 0:
            goto switchD_0011e70c_caseD_0;
          case 2:
            goto switchD_0011e70c_caseD_2;
          case 4:
            goto switchD_0011e70c_caseD_4;
          case 6:
            goto switchD_0011e70c_caseD_6;
          case 8:
            goto switchD_0011e70c_caseD_8;
          case 10:
            goto switchD_0011e70c_caseD_a;
          case 0xc:
            goto switchD_0011e70c_caseD_c;
          case 0xe:
            goto switchD_0011e70c_caseD_e;
          }
        }
        else {
          switch(uVar4) {
          case 0x62:
            goto switchD_0011e761_caseD_62;
          case 99:
          case 0x65:
          case 0x67:
          case 0x69:
          case 0x6b:
            break;
          case 100:
            goto switchD_0011e761_caseD_64;
          case 0x66:
            goto switchD_0011e761_caseD_66;
          case 0x68:
            goto switchD_0011e761_caseD_68;
          case 0x6a:
            goto switchD_0011e761_caseD_6a;
          case 0x6c:
            goto switchD_0011e761_caseD_6c;
          default:
            if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
            if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
          }
        }
        goto switchD_0011ebd9_caseD_1;
      case 0x62:
switchD_0011e761_caseD_62:
        snprintf(buf,buflen,"ASN1 - ASN1 tag was of an unexpected value");
        if (0x29 < uVar4) {
          switch(uVar4) {
          case 100:
            goto switchD_0011e761_caseD_64;
          case 0x65:
          case 0x67:
          case 0x69:
          case 0x6b:
            goto switchD_0011eba1_caseD_1;
          case 0x66:
            goto switchD_0011e761_caseD_66;
          case 0x68:
            goto switchD_0011e761_caseD_68;
          case 0x6a:
            goto switchD_0011e761_caseD_6a;
          case 0x6c:
            goto switchD_0011e761_caseD_6c;
          default:
            if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
          }
          goto switchD_0011eba1_default;
        }
        switch(uVar3) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 2:
          goto switchD_0011e70c_caseD_2;
        case 4:
          goto switchD_0011e70c_caseD_4;
        case 6:
          goto switchD_0011e70c_caseD_6;
        case 8:
          goto switchD_0011e70c_caseD_8;
        case 10:
          goto switchD_0011e70c_caseD_a;
        case 0xc:
          goto switchD_0011e70c_caseD_c;
        }
        goto switchD_0011eba1_caseD_1;
      case 100:
switchD_0011e761_caseD_64:
        snprintf(buf,buflen,"ASN1 - Error when trying to determine the length or invalid length");
        if (0x29 < uVar4) {
          switch(uVar4) {
          case 0x66:
            goto switchD_0011e761_caseD_66;
          case 0x67:
          case 0x69:
          case 0x6b:
            goto switchD_0011eacd_caseD_1;
          case 0x68:
            goto switchD_0011e761_caseD_68;
          case 0x6a:
            goto switchD_0011e761_caseD_6a;
          case 0x6c:
            goto switchD_0011e761_caseD_6c;
          default:
            goto switchD_0011e9e2_default;
          }
        }
        switch(uVar3) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 2:
          goto switchD_0011e70c_caseD_2;
        case 4:
          goto switchD_0011e70c_caseD_4;
        case 6:
          goto switchD_0011e70c_caseD_6;
        case 8:
          goto switchD_0011e70c_caseD_8;
        case 10:
          goto switchD_0011e70c_caseD_a;
        }
        break;
      case 0x66:
switchD_0011e761_caseD_66:
        snprintf(buf,buflen,"ASN1 - Actual length differs from expected length");
        if (uVar4 < 0x2a) {
          switch(uVar3) {
          case 0:
            goto switchD_0011e70c_caseD_0;
          case 2:
            goto switchD_0011e70c_caseD_2;
          case 4:
            goto switchD_0011e70c_caseD_4;
          case 6:
            goto switchD_0011e70c_caseD_6;
          case 8:
            goto switchD_0011e70c_caseD_8;
          case 10:
            goto switchD_0011e70c_caseD_a;
          }
        }
        else {
          if (uVar4 < 0x68) goto switchD_0011e9e2_default;
          if (uVar4 == 0x6c) goto switchD_0011e761_caseD_6c;
          if (uVar4 == 0x6a) goto switchD_0011e761_caseD_6a;
          if (uVar4 == 0x68) goto switchD_0011e761_caseD_68;
        }
        break;
      case 0x68:
switchD_0011e761_caseD_68:
        snprintf(buf,buflen,"ASN1 - Data is invalid");
        if (uVar4 < 0x2a) {
          switch(uVar3) {
          case 0:
            goto switchD_0011e70c_caseD_0;
          case 2:
            goto switchD_0011e70c_caseD_2;
          case 4:
            goto switchD_0011e70c_caseD_4;
          case 6:
            goto switchD_0011e70c_caseD_6;
          case 8:
            goto switchD_0011e70c_caseD_8;
          case 10:
            goto switchD_0011e70c_caseD_a;
          }
        }
        else if (uVar4 < 0x6a) {
switchD_0011e9e2_default:
          if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
          if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
        }
        else {
          if (uVar4 == 0x6c) goto switchD_0011e761_caseD_6c;
          if (uVar4 == 0x6a) goto switchD_0011e761_caseD_6a;
        }
        break;
      case 0x6a:
switchD_0011e761_caseD_6a:
        snprintf(buf,buflen,"ASN1 - Memory allocation failed");
        if (uVar4 < 0x2a) {
          switch(uVar3) {
          case 0:
            goto switchD_0011e70c_caseD_0;
          case 2:
            goto switchD_0011e70c_caseD_2;
          case 4:
            goto switchD_0011e70c_caseD_4;
          case 6:
            goto switchD_0011e70c_caseD_6;
          case 8:
            goto switchD_0011e70c_caseD_8;
          case 10:
            goto switchD_0011e70c_caseD_a;
          }
        }
        else {
          if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
          if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
          if (uVar4 == 0x6c) goto switchD_0011e761_caseD_6c;
        }
        break;
      case 0x6c:
switchD_0011e761_caseD_6c:
        snprintf(buf,buflen,"ASN1 - Buffer too small when writing ASN.1 data structure");
        switch(uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 1:
          goto switchD_0011e70c_caseD_2;
        case 2:
          goto switchD_0011e70c_caseD_4;
        case 3:
          goto switchD_0011e70c_caseD_6;
        case 4:
          goto switchD_0011e70c_caseD_8;
        case 5:
          goto switchD_0011e70c_caseD_a;
        case 6:
          goto switchD_0011e70c_caseD_c;
        default:
          goto switchD_0011eba1_caseD_1;
        case 0x14:
          goto switchD_0011e70c_caseD_28;
        case 0x15:
          goto switchD_0011e70c_caseD_2a;
        }
      case 0x6e:
        goto switchD_0011f645_caseD_6e;
      case 0x70:
        goto switchD_0011f645_caseD_70;
      case 0x72:
        goto switchD_0011f645_caseD_72;
      case 0x7a:
        goto switchD_0011f220_caseD_7a;
      }
switchD_0011eacd_caseD_1:
      if (0x33 < uVar4) {
        switch(uVar4) {
        case 0x51:
          goto switchD_0011e70c_caseD_4f;
        case 0x52:
          goto switchD_0011e70c_caseD_1;
        case 0x53:
          goto switchD_0011e70c_caseD_51;
        case 0x54:
          goto switchD_0011e70c_caseD_52;
        case 0x55:
          goto switchD_0011e70c_caseD_53;
        case 0x56:
          goto switchD_0011e70c_caseD_54;
        default:
          switch(uVar4) {
          case 0x34:
            goto switchD_0011e70c_caseD_32;
          case 0x35:
          case 0x37:
          case 0x39:
            goto switchD_0011e70c_caseD_1;
          case 0x36:
            goto switchD_0011e70c_caseD_34;
          case 0x38:
            goto switchD_0011e70c_caseD_36;
          case 0x3a:
            goto switchD_0011e70c_caseD_38;
          default:
switchD_0011e761_default:
            if (uVar4 != 0x7a) goto switchD_0011e70c_caseD_1;
            goto switchD_0011f220_caseD_7a;
          }
        }
      }
      switch(uVar4) {
      case 0xd:
        goto switchD_0011e70c_caseD_b;
      case 0xe:
switchD_0011e70c_caseD_c:
        snprintf(buf,buflen,"BIGNUM - The input arguments are not acceptable");
switchD_0011eba1_caseD_1:
        if (uVar4 < 0x24) {
          switch(uVar4) {
          case 0xd:
            goto switchD_0011e70c_caseD_b;
          case 0xf:
            goto switchD_0011e70c_caseD_d;
          case 0x10:
            goto switchD_0011e70c_caseD_e;
          case 0x11:
            goto switchD_0011e70c_caseD_f;
          case 0x16:
            goto switchD_0011e70c_caseD_14;
          case 0x17:
            goto switchD_0011e70c_caseD_15;
          case 0x18:
            goto switchD_0011e70c_caseD_16;
          }
          break;
        }
        switch(uVar4) {
        case 0x24:
          goto switchD_0011e70c_caseD_22;
        case 0x25:
        case 0x28:
        case 0x29:
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x2e:
        case 0x2f:
        case 0x30:
        case 0x31:
        case 0x35:
        case 0x37:
        case 0x39:
        case 0x3b:
        case 0x3d:
        case 0x3f:
          break;
        case 0x26:
          goto switchD_0011e70c_caseD_24;
        case 0x27:
          goto switchD_0011e70c_caseD_25;
        case 0x32:
          goto switchD_0011f497_caseD_32;
        case 0x33:
          goto switchD_0011f497_caseD_33;
        case 0x34:
          goto switchD_0011e70c_caseD_32;
        case 0x36:
          goto switchD_0011e70c_caseD_34;
        case 0x38:
          goto switchD_0011e70c_caseD_36;
        case 0x3a:
          goto switchD_0011e70c_caseD_38;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          switch(uVar4) {
          case 0x51:
            goto switchD_0011e70c_caseD_4f;
          case 0x52:
            break;
          case 0x53:
            goto switchD_0011e70c_caseD_51;
          case 0x54:
            goto switchD_0011e70c_caseD_52;
          case 0x55:
            goto switchD_0011e70c_caseD_53;
          case 0x56:
            goto switchD_0011e70c_caseD_54;
          default:
            if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
          }
        }
        break;
      case 0xf:
        goto switchD_0011e70c_caseD_d;
      case 0x10:
        goto switchD_0011e70c_caseD_e;
      case 0x11:
        goto switchD_0011e70c_caseD_f;
      default:
        goto switchD_0011e70c_caseD_1;
      case 0x16:
        goto switchD_0011e70c_caseD_14;
      case 0x17:
        goto switchD_0011e70c_caseD_15;
      case 0x18:
        goto switchD_0011e70c_caseD_16;
      case 0x24:
        goto switchD_0011e70c_caseD_22;
      case 0x26:
        goto switchD_0011e70c_caseD_24;
      case 0x27:
        goto switchD_0011e70c_caseD_25;
      }
      goto switchD_0011ed3c_caseD_25;
    case 0x1f:
switchD_0011e70c_caseD_1f:
      snprintf(buf,buflen,"AES - Invalid input data");
      if (uVar4 < 0x53) {
        switch(uVar3) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 1:
        case 3:
        case 5:
        case 7:
        case 9:
        case 0x10:
        case 0x11:
        case 0x12:
        case 0x13:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x26:
        case 0x27:
        case 0x29:
          break;
        case 2:
          goto switchD_0011e70c_caseD_2;
        case 4:
          goto switchD_0011e70c_caseD_4;
        case 6:
          goto switchD_0011e70c_caseD_6;
        case 8:
          goto switchD_0011e70c_caseD_8;
        case 10:
          goto switchD_0011e70c_caseD_a;
        case 0xb:
          goto switchD_0011e70c_caseD_b;
        case 0xc:
          goto switchD_0011e70c_caseD_c;
        case 0xd:
          goto switchD_0011e70c_caseD_d;
        case 0xe:
          goto switchD_0011e70c_caseD_e;
        case 0xf:
          goto switchD_0011e70c_caseD_f;
        case 0x14:
          goto switchD_0011e70c_caseD_14;
        case 0x15:
          goto switchD_0011e70c_caseD_15;
        case 0x16:
          goto switchD_0011e70c_caseD_16;
        case 0x17:
          goto switchD_0011e70c_caseD_17;
        case 0x21:
          goto switchD_0011e70c_caseD_21;
        case 0x22:
          goto switchD_0011e70c_caseD_22;
        case 0x23:
          goto switchD_0011e70c_caseD_23;
        case 0x24:
          goto switchD_0011e70c_caseD_24;
        case 0x25:
          goto switchD_0011e70c_caseD_25;
        case 0x28:
          goto switchD_0011e70c_caseD_28;
        case 0x2a:
          goto switchD_0011e70c_caseD_2a;
        default:
          if (uVar4 == 0x51) goto switchD_0011e70c_caseD_4f;
        }
      }
      else {
        switch(uVar4) {
        case 0x60:
          goto switchD_0011e761_caseD_60;
        case 0x61:
        case 99:
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6b:
          break;
        case 0x62:
          goto switchD_0011e761_caseD_62;
        case 100:
          goto switchD_0011e761_caseD_64;
        case 0x66:
          goto switchD_0011e761_caseD_66;
        case 0x68:
          goto switchD_0011e761_caseD_68;
        case 0x6a:
          goto switchD_0011e761_caseD_6a;
        case 0x6c:
          goto switchD_0011e761_caseD_6c;
        default:
          if (uVar4 == 0x53) goto switchD_0011e70c_caseD_51;
          if (uVar4 == 0x55) goto switchD_0011e70c_caseD_53;
        }
      }
      goto code_r0x0011f1bd;
    case 0x20:
switchD_0011e70c_caseD_20:
      snprintf(buf,buflen,"AES - Invalid data input length");
      switch(uVar3) {
      case 0:
        goto switchD_0011e70c_caseD_0;
      case 1:
      case 3:
      case 5:
      case 7:
      case 9:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x20:
      case 0x26:
      case 0x27:
      case 0x29:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x33:
      case 0x35:
      case 0x37:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x3f:
      case 0x40:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x50:
        break;
      case 2:
        goto switchD_0011e70c_caseD_2;
      case 4:
        goto switchD_0011e70c_caseD_4;
      case 6:
        goto switchD_0011e70c_caseD_6;
      case 8:
        goto switchD_0011e70c_caseD_8;
      case 10:
        goto switchD_0011e70c_caseD_a;
      case 0xb:
        goto switchD_0011e70c_caseD_b;
      case 0xc:
        goto switchD_0011e70c_caseD_c;
      case 0xd:
        goto switchD_0011e70c_caseD_d;
      case 0xe:
        goto switchD_0011e70c_caseD_e;
      case 0xf:
        goto switchD_0011e70c_caseD_f;
      case 0x14:
        goto switchD_0011e70c_caseD_14;
      case 0x15:
        goto switchD_0011e70c_caseD_15;
      case 0x16:
        goto switchD_0011e70c_caseD_16;
      case 0x17:
        goto switchD_0011e70c_caseD_17;
      case 0x1f:
        goto switchD_0011e70c_caseD_1f;
      case 0x21:
        goto switchD_0011e70c_caseD_21;
      case 0x22:
        goto switchD_0011e70c_caseD_22;
      case 0x23:
        goto switchD_0011e70c_caseD_23;
      case 0x24:
        goto switchD_0011e70c_caseD_24;
      case 0x25:
        goto switchD_0011e70c_caseD_25;
      case 0x28:
        goto switchD_0011e70c_caseD_28;
      case 0x2a:
        goto switchD_0011e70c_caseD_2a;
      case 0x30:
        goto switchD_0011f497_caseD_32;
      case 0x31:
        goto switchD_0011f497_caseD_33;
      case 0x32:
        goto switchD_0011e70c_caseD_32;
      case 0x34:
        goto switchD_0011e70c_caseD_34;
      case 0x36:
        goto switchD_0011e70c_caseD_36;
      case 0x38:
        goto switchD_0011e70c_caseD_38;
      case 0x4f:
        goto switchD_0011e70c_caseD_4f;
      case 0x51:
        goto switchD_0011e70c_caseD_51;
      case 0x52:
        goto switchD_0011e70c_caseD_52;
      case 0x53:
        goto switchD_0011e70c_caseD_53;
      case 0x54:
        goto switchD_0011e70c_caseD_54;
      default:
        switch(uVar4) {
        case 0x60:
          goto switchD_0011e761_caseD_60;
        case 0x61:
        case 99:
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6b:
          break;
        case 0x62:
          goto switchD_0011e761_caseD_62;
        case 100:
          goto switchD_0011e761_caseD_64;
        case 0x66:
          goto switchD_0011e761_caseD_66;
        case 0x68:
          goto switchD_0011e761_caseD_68;
        case 0x6a:
          goto switchD_0011e761_caseD_6a;
        case 0x6c:
          goto switchD_0011e761_caseD_6c;
        default:
          if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
        }
      }
      goto switchD_0011f333_caseD_35;
    case 0x21:
switchD_0011e70c_caseD_21:
      snprintf(buf,buflen,"AES - Feature not available. For example, an unsupported AES key size");
      switch(uVar3) {
      case 0:
        goto switchD_0011e70c_caseD_0;
      case 1:
      case 3:
      case 5:
      case 7:
      case 9:
      case 0xb:
      case 0xd:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x26:
      case 0x27:
      case 0x29:
        break;
      case 2:
        goto switchD_0011e70c_caseD_2;
      case 4:
        goto switchD_0011e70c_caseD_4;
      case 6:
        goto switchD_0011e70c_caseD_6;
      case 8:
        goto switchD_0011e70c_caseD_8;
      case 10:
        goto switchD_0011e70c_caseD_a;
      case 0xc:
        goto switchD_0011e70c_caseD_c;
      case 0xe:
        goto switchD_0011e70c_caseD_e;
      case 0x14:
        goto switchD_0011e70c_caseD_14;
      case 0x15:
        goto switchD_0011e70c_caseD_15;
      case 0x16:
        goto switchD_0011e70c_caseD_16;
      case 0x17:
        goto switchD_0011e70c_caseD_17;
      case 0x22:
        goto switchD_0011e70c_caseD_22;
      case 0x23:
        goto switchD_0011e70c_caseD_23;
      case 0x24:
        goto switchD_0011e70c_caseD_24;
      case 0x25:
        goto switchD_0011e70c_caseD_25;
      case 0x28:
        goto switchD_0011e70c_caseD_28;
      case 0x2a:
        goto switchD_0011e70c_caseD_2a;
      default:
        switch(uVar4) {
        case 0x60:
          goto switchD_0011e761_caseD_60;
        case 0x62:
          goto switchD_0011e761_caseD_62;
        case 100:
          goto switchD_0011e761_caseD_64;
        case 0x66:
          goto switchD_0011e761_caseD_66;
        case 0x68:
          goto switchD_0011e761_caseD_68;
        case 0x6a:
          goto switchD_0011e761_caseD_6a;
        case 0x6c:
          goto switchD_0011e761_caseD_6c;
        }
      }
      goto code_r0x0011f059;
    case 0x22:
      goto switchD_0011e70c_caseD_22;
    case 0x23:
switchD_0011e70c_caseD_23:
      snprintf(buf,buflen,"AES - AES hardware accelerator failed");
      if (uVar4 < 0x2a) {
        switch(uVar3) {
        case 0:
          goto switchD_0011e70c_caseD_0;
        case 2:
          goto switchD_0011e70c_caseD_2;
        case 4:
          goto switchD_0011e70c_caseD_4;
        case 6:
          goto switchD_0011e70c_caseD_6;
        case 8:
          goto switchD_0011e70c_caseD_8;
        case 10:
          goto switchD_0011e70c_caseD_a;
        case 0xc:
          goto switchD_0011e70c_caseD_c;
        case 0xe:
          goto switchD_0011e70c_caseD_e;
        case 0x14:
          goto switchD_0011e70c_caseD_14;
        case 0x15:
          goto switchD_0011e70c_caseD_15;
        case 0x16:
          goto switchD_0011e70c_caseD_16;
        case 0x17:
          goto switchD_0011e70c_caseD_17;
        }
      }
      else {
        switch(uVar4) {
        case 0x60:
          goto switchD_0011e761_caseD_60;
        case 0x61:
        case 99:
        case 0x65:
        case 0x67:
        case 0x69:
        case 0x6b:
          break;
        case 0x62:
          goto switchD_0011e761_caseD_62;
        case 100:
          goto switchD_0011e761_caseD_64;
        case 0x66:
          goto switchD_0011e761_caseD_66;
        case 0x68:
          goto switchD_0011e761_caseD_68;
        case 0x6a:
          goto switchD_0011e761_caseD_6a;
        case 0x6c:
          goto switchD_0011e761_caseD_6c;
        default:
          if (uVar4 == 0x2a) goto switchD_0011e70c_caseD_28;
          if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
        }
      }
      goto switchD_0011e892_caseD_1;
    case 0x24:
      goto switchD_0011e70c_caseD_24;
    case 0x25:
      goto switchD_0011e70c_caseD_25;
    case 0x28:
switchD_0011e70c_caseD_28:
      snprintf(buf,buflen,"BASE64 - Output buffer too small");
      switch(uVar3) {
      case 0:
        goto switchD_0011e70c_caseD_0;
      case 1:
      case 3:
      case 5:
      case 7:
      case 9:
      case 0xb:
        break;
      case 2:
        goto switchD_0011e70c_caseD_2;
      case 4:
        goto switchD_0011e70c_caseD_4;
      case 6:
        goto switchD_0011e70c_caseD_6;
      case 8:
        goto switchD_0011e70c_caseD_8;
      case 10:
        goto switchD_0011e70c_caseD_a;
      case 0xc:
        goto switchD_0011e70c_caseD_c;
      default:
switchD_0011eba1_default:
        if (uVar4 == 0x2c) goto switchD_0011e70c_caseD_2a;
      }
      goto switchD_0011eba1_caseD_1;
    case 0x2a:
switchD_0011e70c_caseD_2a:
      snprintf(buf,buflen,"BASE64 - Invalid character in input");
      switch(uVar3) {
      case 0:
        goto switchD_0011e70c_caseD_0;
      default:
        goto switchD_0011ebd9_caseD_1;
      case 2:
        goto switchD_0011e70c_caseD_2;
      case 4:
        goto switchD_0011e70c_caseD_4;
      case 6:
        goto switchD_0011e70c_caseD_6;
      case 8:
        goto switchD_0011e70c_caseD_8;
      case 10:
        goto switchD_0011e70c_caseD_a;
      case 0xc:
        goto switchD_0011e70c_caseD_c;
      case 0xe:
        goto switchD_0011e70c_caseD_e;
      }
    case 0x32:
      goto switchD_0011e70c_caseD_32;
    case 0x34:
      goto switchD_0011e70c_caseD_34;
    case 0x36:
      goto switchD_0011e70c_caseD_36;
    case 0x38:
      goto switchD_0011e70c_caseD_38;
    case 0x4f:
      goto switchD_0011e70c_caseD_4f;
    case 0x51:
      goto switchD_0011e70c_caseD_51;
    case 0x52:
      goto switchD_0011e70c_caseD_52;
    case 0x53:
      goto switchD_0011e70c_caseD_53;
    case 0x54:
      goto switchD_0011e70c_caseD_54;
    default:
      switch(uVar4) {
      case 0x60:
        goto switchD_0011e761_caseD_60;
      case 0x61:
      case 99:
      case 0x65:
      case 0x67:
      case 0x69:
      case 0x6b:
        goto switchD_0011e70c_caseD_1;
      case 0x62:
        goto switchD_0011e761_caseD_62;
      case 100:
        goto switchD_0011e761_caseD_64;
      case 0x66:
        goto switchD_0011e761_caseD_66;
      case 0x68:
        goto switchD_0011e761_caseD_68;
      case 0x6a:
        goto switchD_0011e761_caseD_6a;
      case 0x6c:
        goto switchD_0011e761_caseD_6c;
      }
      goto switchD_0011e761_default;
    }
switchD_0011e744_caseD_1:
    if (0x50 < uVar4) {
      switch(uVar4) {
      case 0x51:
switchD_0011e70c_caseD_4f:
        snprintf(buf,buflen,"CHACHA20 - Invalid input parameter(s)");
        if (uVar4 < 0x53) {
LAB_0011f1cd:
          if (uVar4 == 0x34) goto switchD_0011e70c_caseD_32;
          if (uVar4 == 0x36) goto switchD_0011e70c_caseD_34;
        }
        else {
          switch(uVar4) {
          case 0x53:
            goto switchD_0011e70c_caseD_51;
          case 0x54:
            goto switchD_0011e70c_caseD_52;
          case 0x55:
            goto switchD_0011e70c_caseD_53;
          case 0x56:
            goto switchD_0011e70c_caseD_54;
          default:
switchD_0011f166_default:
            if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
          }
        }
        goto switchD_0011f12b_caseD_52;
      case 0x52:
        goto switchD_0011ee57_caseD_25;
      case 0x53:
switchD_0011e70c_caseD_51:
        snprintf(buf,buflen,
                 "CHACHA20 - Feature not available. For example, s part of the API is not implemented"
                );
        if (uVar4 < 0x54) {
          if (uVar4 == 0x34) goto switchD_0011e70c_caseD_32;
          if (uVar4 == 0x36) goto switchD_0011e70c_caseD_34;
          if (uVar4 == 0x38) goto switchD_0011e70c_caseD_36;
        }
        else if (uVar4 < 0x56) {
          if (uVar4 == 0x54) goto switchD_0011e70c_caseD_52;
          if (uVar4 == 0x55) goto switchD_0011e70c_caseD_53;
        }
        else {
          if (uVar4 == 0x56) goto switchD_0011e70c_caseD_54;
          if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
        }
        goto LAB_0011f40e;
      case 0x54:
switchD_0011e70c_caseD_52:
        snprintf(buf,buflen,
                 "CHACHAPOLY - The requested operation is not permitted in the current state");
        switch(uVar4) {
        case 0x34:
          goto switchD_0011e70c_caseD_32;
        case 0x35:
        case 0x37:
        case 0x39:
          break;
        case 0x36:
          goto switchD_0011e70c_caseD_34;
        case 0x38:
          goto switchD_0011e70c_caseD_36;
        case 0x3a:
          goto switchD_0011e70c_caseD_38;
        default:
          if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
          if (uVar4 == 0x56) goto switchD_0011e70c_caseD_54;
        }
        break;
      case 0x55:
switchD_0011e70c_caseD_53:
        snprintf(buf,buflen,"CHACHA20 - Chacha20 hardware accelerator failed");
code_r0x0011f1bd:
        switch(uVar4) {
        case 1:
          goto switchD_0011f61e_caseD_1;
        case 2:
        case 4:
        case 6:
        case 8:
        case 10:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
        case 0x15:
        case 0x16:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
        case 0x1c:
        case 0x1d:
        case 0x1e:
        case 0x1f:
        case 0x20:
        case 0x21:
        case 0x22:
        case 0x23:
        case 0x24:
        case 0x25:
        case 0x26:
        case 0x27:
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x3b:
          goto switchD_0011ff15_caseD_32;
        case 3:
          goto switchD_0011f972_caseD_3;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        case 0x12:
          goto switchD_0011f972_caseD_12;
        case 0x13:
          goto switchD_0011f972_caseD_13;
        case 0x14:
          goto switchD_0011f972_caseD_14;
        case 0x28:
          goto switchD_0011f92e_caseD_28;
        case 0x29:
          goto switchD_0011f92e_caseD_29;
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        case 0x32:
          goto switchD_0011f497_caseD_32;
        case 0x33:
          goto switchD_0011f497_caseD_33;
        case 0x34:
          goto switchD_0011e70c_caseD_32;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x36:
          goto switchD_0011e70c_caseD_34;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x38:
          goto switchD_0011e70c_caseD_36;
        case 0x39:
          goto switchD_0011ff15_caseD_39;
        case 0x3a:
          goto switchD_0011e70c_caseD_38;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          case 0x6f:
          case 0x71:
          case 0x76:
          case 0x77:
          case 0x78:
          case 0x79:
            goto switchD_0011ff15_caseD_32;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          case 0x7a:
            goto switchD_0011f220_caseD_7a;
          default:
            switch(uVar4) {
            case 0x54:
              goto switchD_0011e70c_caseD_52;
            default:
              goto switchD_0011ff15_caseD_32;
            case 0x56:
              goto switchD_0011e70c_caseD_54;
            case 0x57:
              goto switchD_0011f39a_caseD_57;
            case 0x59:
              goto switchD_0011f39a_caseD_59;
            case 0x5b:
              goto switchD_0011f39a_caseD_5b;
            }
          }
        }
      case 0x56:
switchD_0011e70c_caseD_54:
        snprintf(buf,buflen,"CHACHAPOLY - Authenticated decryption failed: data was not authentic");
        goto switchD_0011efef_caseD_52;
      default:
        if (uVar4 != 0x7a) goto switchD_0011ee57_caseD_25;
        goto switchD_0011f220_caseD_7a;
      }
      goto switchD_0011e70c_caseD_1;
    }
    switch(uVar4) {
    case 0x24:
switchD_0011e70c_caseD_22:
      snprintf(buf,buflen,"CAMELLIA - Bad input data");
      if (uVar4 < 0x26) goto LAB_0011eff1;
      switch(uVar4) {
      case 0x51:
        goto switchD_0011e70c_caseD_4f;
      case 0x52:
        break;
      case 0x53:
        goto switchD_0011e70c_caseD_51;
      case 0x54:
        goto switchD_0011e70c_caseD_52;
      case 0x55:
        goto switchD_0011e70c_caseD_53;
      case 0x56:
        goto switchD_0011e70c_caseD_54;
      default:
        if (uVar4 == 0x27) goto switchD_0011e70c_caseD_25;
        if (uVar4 == 0x26) goto switchD_0011e70c_caseD_24;
      }
      break;
    case 0x25:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3b:
      goto switchD_0011ee57_caseD_25;
    case 0x26:
switchD_0011e70c_caseD_24:
      snprintf(buf,buflen,"CAMELLIA - Invalid data input length");
      if (uVar4 < 0x27) {
LAB_0011eff1:
        if (uVar4 == 0xd) goto switchD_0011e70c_caseD_b;
        if (uVar4 == 0xf) goto switchD_0011e70c_caseD_d;
        if (uVar4 == 0x11) goto switchD_0011e70c_caseD_f;
      }
      else {
        switch(uVar4) {
        case 0x51:
          goto switchD_0011e70c_caseD_4f;
        case 0x52:
          break;
        case 0x53:
          goto switchD_0011e70c_caseD_51;
        case 0x54:
          goto switchD_0011e70c_caseD_52;
        case 0x55:
          goto switchD_0011e70c_caseD_53;
        case 0x56:
          goto switchD_0011e70c_caseD_54;
        default:
          if (uVar4 == 0x27) goto switchD_0011e70c_caseD_25;
        }
      }
      break;
    case 0x27:
switchD_0011e70c_caseD_25:
      snprintf(buf,buflen,"CAMELLIA - Camellia hardware accelerator failed");
code_r0x0011f059:
      switch(uVar4) {
      case 1:
        goto switchD_0011f61e_caseD_1;
      case 2:
      case 4:
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xe:
      case 0x10:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x39:
      case 0x3b:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x52:
      case 0x58:
      case 0x5a:
        break;
      case 3:
        goto switchD_0011f972_caseD_3;
      case 5:
        goto switchD_0011f972_caseD_5;
      case 7:
        goto switchD_0011f972_caseD_7;
      case 9:
        goto switchD_0011f972_caseD_9;
      case 0xb:
        goto switchD_0011f972_caseD_b;
      case 0xd:
switchD_0011e70c_caseD_b:
        snprintf(buf,buflen,"CCM - Bad input parameters to the function");
        if (uVar4 < 0x51) {
          if (uVar4 == 0xf) goto switchD_0011e70c_caseD_d;
          goto LAB_0011f0dd;
        }
        switch(uVar4) {
        case 0x51:
          goto switchD_0011e70c_caseD_4f;
        case 0x52:
          break;
        case 0x53:
          goto switchD_0011e70c_caseD_51;
        case 0x54:
          goto switchD_0011e70c_caseD_52;
        case 0x55:
          goto switchD_0011e70c_caseD_53;
        case 0x56:
          goto switchD_0011e70c_caseD_54;
        default:
switchD_0011f0db_default:
          if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
        }
        goto code_r0x0011f352;
      case 0xf:
switchD_0011e70c_caseD_d:
        snprintf(buf,buflen,"CCM - Authenticated decryption failed");
        if (0x50 < uVar4) {
          switch(uVar4) {
          case 0x51:
            goto switchD_0011e70c_caseD_4f;
          case 0x52:
            goto code_r0x0011f352;
          case 0x53:
            goto switchD_0011e70c_caseD_51;
          case 0x54:
            goto switchD_0011e70c_caseD_52;
          case 0x55:
            goto switchD_0011e70c_caseD_53;
          case 0x56:
            goto switchD_0011e70c_caseD_54;
          default:
            goto switchD_0011f0db_default;
          }
        }
LAB_0011f0dd:
        if (uVar4 == 0x11) goto switchD_0011e70c_caseD_f;
        if (uVar4 == 0x34) goto switchD_0011e70c_caseD_32;
        goto code_r0x0011f352;
      case 0x11:
switchD_0011e70c_caseD_f:
        snprintf(buf,buflen,"CCM - CCM hardware accelerator failed");
        if (0x50 < uVar4) {
          switch(uVar4) {
          case 0x51:
            goto switchD_0011e70c_caseD_4f;
          case 0x52:
            goto switchD_0011f12b_caseD_52;
          case 0x53:
            goto switchD_0011e70c_caseD_51;
          case 0x54:
            goto switchD_0011e70c_caseD_52;
          case 0x55:
            goto switchD_0011e70c_caseD_53;
          case 0x56:
            goto switchD_0011e70c_caseD_54;
          default:
            goto switchD_0011f166_default;
          }
        }
        goto LAB_0011f1cd;
      case 0x12:
        goto switchD_0011f972_caseD_12;
      case 0x13:
        goto switchD_0011f972_caseD_13;
      case 0x14:
        goto switchD_0011f972_caseD_14;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x32:
        goto switchD_0011f497_caseD_32;
      case 0x33:
        goto switchD_0011f497_caseD_33;
      case 0x34:
        goto switchD_0011e70c_caseD_32;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x36:
        goto switchD_0011e70c_caseD_34;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x38:
        goto switchD_0011e70c_caseD_36;
      case 0x3a:
        goto switchD_0011e70c_caseD_38;
      case 0x3c:
        goto switchD_0011f497_caseD_3c;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3e:
        goto switchD_0011f497_caseD_3e;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      case 0x40:
        goto switchD_0011f497_caseD_40;
      case 0x51:
        goto switchD_0011e70c_caseD_4f;
      case 0x53:
        goto switchD_0011e70c_caseD_51;
      case 0x54:
        goto switchD_0011e70c_caseD_52;
      case 0x55:
        goto switchD_0011e70c_caseD_53;
      case 0x56:
        goto switchD_0011e70c_caseD_54;
      case 0x57:
        goto switchD_0011f39a_caseD_57;
      case 0x59:
        goto switchD_0011f39a_caseD_59;
      case 0x5b:
        goto switchD_0011f39a_caseD_5b;
      default:
        switch(uVar4) {
        case 0x6e:
          goto switchD_0011f645_caseD_6e;
        case 0x6f:
        case 0x71:
          break;
        case 0x70:
          goto switchD_0011f645_caseD_70;
        case 0x72:
          goto switchD_0011f645_caseD_72;
        case 0x73:
          goto code_r0x0011ffa0;
        default:
          if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
        }
      }
      goto switchD_0011f360_caseD_34;
    case 0x32:
      goto switchD_0011f497_caseD_32;
    case 0x33:
      goto switchD_0011f497_caseD_33;
    case 0x34:
      goto switchD_0011e70c_caseD_32;
    case 0x36:
      goto switchD_0011e70c_caseD_34;
    case 0x38:
      goto switchD_0011e70c_caseD_36;
    case 0x3a:
      goto switchD_0011e70c_caseD_38;
    case 0x3c:
      goto switchD_0011f497_caseD_3c;
    case 0x3d:
      goto switchD_0011f497_caseD_3d;
    case 0x3e:
      goto switchD_0011f497_caseD_3e;
    case 0x3f:
      goto switchD_0011f497_caseD_3f;
    case 0x40:
      goto switchD_0011f497_caseD_40;
    default:
      switch(uVar4) {
      case 0xd:
        goto switchD_0011e70c_caseD_b;
      default:
        goto switchD_0011ee57_caseD_25;
      case 0xf:
        goto switchD_0011e70c_caseD_d;
      case 0x11:
        goto switchD_0011e70c_caseD_f;
      case 0x17:
switchD_0011e70c_caseD_15:
        snprintf(buf,buflen,"BLOWFISH - Blowfish hardware accelerator failed");
switchD_0011e892_caseD_1:
        if (uVar4 < 0x51) {
          switch(uVar4) {
          case 0x24:
            goto switchD_0011e70c_caseD_22;
          case 0x25:
          case 0x28:
          case 0x29:
          case 0x2a:
          case 0x2b:
          case 0x2c:
          case 0x2d:
          case 0x2e:
          case 0x2f:
          case 0x30:
          case 0x31:
          case 0x35:
          case 0x37:
          case 0x39:
          case 0x3b:
            break;
          case 0x26:
            goto switchD_0011e70c_caseD_24;
          case 0x27:
            goto switchD_0011e70c_caseD_25;
          case 0x32:
            goto switchD_0011f497_caseD_32;
          case 0x33:
            goto switchD_0011f497_caseD_33;
          case 0x34:
            goto switchD_0011e70c_caseD_32;
          case 0x36:
            goto switchD_0011e70c_caseD_34;
          case 0x38:
            goto switchD_0011e70c_caseD_36;
          case 0x3a:
            goto switchD_0011e70c_caseD_38;
          case 0x3c:
            goto switchD_0011f497_caseD_3c;
          case 0x3d:
            goto switchD_0011f497_caseD_3d;
          case 0x3e:
            goto switchD_0011f497_caseD_3e;
          case 0x3f:
            goto switchD_0011f497_caseD_3f;
          case 0x40:
            goto switchD_0011f497_caseD_40;
          default:
            switch(uVar4) {
            case 1:
              goto switchD_0011f61e_caseD_1;
            case 3:
              goto switchD_0011f972_caseD_3;
            case 5:
              goto switchD_0011f972_caseD_5;
            case 7:
              goto switchD_0011f972_caseD_7;
            case 9:
              goto switchD_0011f972_caseD_9;
            case 0xd:
              goto switchD_0011e70c_caseD_b;
            case 0xf:
              goto switchD_0011e70c_caseD_d;
            case 0x11:
              goto switchD_0011e70c_caseD_f;
            case 0x12:
              goto switchD_0011f972_caseD_12;
            case 0x13:
              goto switchD_0011f972_caseD_13;
            case 0x14:
              goto switchD_0011f972_caseD_14;
            }
          }
        }
        else {
          switch(uVar4) {
          case 0x51:
            goto switchD_0011e70c_caseD_4f;
          case 0x52:
            break;
          case 0x53:
            goto switchD_0011e70c_caseD_51;
          case 0x54:
            goto switchD_0011e70c_caseD_52;
          case 0x55:
            goto switchD_0011e70c_caseD_53;
          case 0x56:
            goto switchD_0011e70c_caseD_54;
          default:
            if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
            if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
          }
        }
        goto switchD_0011eeff_caseD_52;
      case 0x18:
switchD_0011e70c_caseD_16:
        snprintf(buf,buflen,"BLOWFISH - Invalid data input length");
switchD_0011ec9d_caseD_b:
        if (0x6d < uVar4) {
          if (uVar4 < 0x72) {
            if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
            if (uVar4 != 0x70) break;
            goto switchD_0011f645_caseD_70;
          }
          if (uVar4 != 0x72) {
            if (uVar4 == 0x7a) goto switchD_0011f220_caseD_7a;
            break;
          }
          goto switchD_0011f645_caseD_72;
        }
        switch(uVar4) {
        case 1:
          goto switchD_0011f61e_caseD_1;
        case 3:
          goto switchD_0011f972_caseD_3;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        case 0xd:
          goto switchD_0011e70c_caseD_b;
        case 0xf:
          goto switchD_0011e70c_caseD_d;
        case 0x11:
          goto switchD_0011e70c_caseD_f;
        case 0x12:
          goto switchD_0011f972_caseD_12;
        case 0x13:
          goto switchD_0011f972_caseD_13;
        case 0x14:
          goto switchD_0011f972_caseD_14;
        case 0x17:
          goto switchD_0011e70c_caseD_15;
        case 0x24:
          goto switchD_0011e70c_caseD_22;
        case 0x26:
          goto switchD_0011e70c_caseD_24;
        case 0x27:
          goto switchD_0011e70c_caseD_25;
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x32:
          goto switchD_0011f497_caseD_32;
        case 0x33:
          goto switchD_0011f497_caseD_33;
        case 0x34:
          goto switchD_0011e70c_caseD_32;
        case 0x36:
          goto switchD_0011e70c_caseD_34;
        case 0x38:
          goto switchD_0011e70c_caseD_36;
        case 0x3a:
          goto switchD_0011e70c_caseD_38;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        case 0x51:
          goto switchD_0011e70c_caseD_4f;
        case 0x53:
          goto switchD_0011e70c_caseD_51;
        case 0x54:
          goto switchD_0011e70c_caseD_52;
        case 0x55:
          goto switchD_0011e70c_caseD_53;
        case 0x56:
          goto switchD_0011e70c_caseD_54;
        case 0x57:
          goto switchD_0011f39a_caseD_57;
        case 0x59:
          goto switchD_0011f39a_caseD_59;
        case 0x5b:
          goto switchD_0011f39a_caseD_5b;
        }
      }
      goto switchD_0011f497_caseD_31;
    }
switchD_0011efef_caseD_52:
    if (0x6d < uVar4) {
      if (0x71 < uVar4) {
        if (uVar4 != 0x72) {
          if (uVar4 != 0x7a) goto switchD_0011f39a_caseD_37;
switchD_0011f220_caseD_7a:
          snprintf(buf,buflen,"CMAC - CMAC hardware accelerator failed");
          switch(uVar4) {
          case 0x32:
            goto switchD_0011f497_caseD_32;
          case 0x33:
            goto switchD_0011f497_caseD_33;
          case 0x34:
            goto switchD_0011e70c_caseD_32;
          case 0x36:
            goto switchD_0011e70c_caseD_34;
          case 0x38:
            goto switchD_0011e70c_caseD_36;
          case 0x3a:
            goto switchD_0011e70c_caseD_38;
          }
          goto switchD_0011f333_caseD_35;
        }
switchD_0011f645_caseD_72:
        snprintf(buf,buflen,"PLATFORM - The requested feature is not supported by the platform");
        if (uVar4 < 0x57) {
          if (uVar4 == 0x31) goto switchD_0011ff15_caseD_31;
          if (uVar4 == 0x35) goto switchD_0011ff15_caseD_35;
        }
        else {
          if (uVar4 == 0x5b) goto switchD_0011f39a_caseD_5b;
          if (uVar4 == 0x59) goto switchD_0011f39a_caseD_59;
          if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
        }
        goto switchD_0011f39a_caseD_37;
      }
      if (uVar4 == 0x6e) {
switchD_0011f645_caseD_6e:
        snprintf(buf,buflen,"ERROR - This is a bug in the library");
        goto switchD_0011f4c8_caseD_34;
      }
      if (uVar4 != 0x70) goto switchD_0011f39a_caseD_37;
switchD_0011f645_caseD_70:
      snprintf(buf,buflen,"PLATFORM - Hardware accelerator failed");
      if (0x58 < uVar4) {
        if (uVar4 == 0x59) goto switchD_0011f39a_caseD_59;
        if (uVar4 == 0x5b) goto switchD_0011f39a_caseD_5b;
        if (uVar4 != 0x72) goto LAB_0011ff48;
        goto switchD_0011f645_caseD_72;
      }
      if (uVar4 == 0x31) goto switchD_0011ff15_caseD_31;
      if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
      goto LAB_0011ff48;
    }
    switch(uVar4) {
    case 0x2e:
switchD_0011f92e_caseD_2e:
      snprintf(buf,buflen,"OID - OID is not found");
switchD_0011fa89_caseD_4:
      if (0x56 < uVar4) {
        if (0x6f < uVar4) {
          switch(uVar4) {
          case 0x70:
            goto switchD_0011f645_caseD_70;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      if (0x2f < uVar4) {
        switch(uVar4) {
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        default:
          goto switchD_0011ff15_caseD_32;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x39:
          goto switchD_0011ff15_caseD_39;
        }
      }
      if (uVar4 == 0xb) goto switchD_0011f972_caseD_b;
      goto switchD_0011ff15_default;
    case 0x2f:
switchD_0011f92e_caseD_2f:
      snprintf(buf,buflen,"MD5 - MD5 hardware accelerator failed");
      if (uVar4 < 0x57) {
        if (uVar4 == 0xb) {
switchD_0011f972_caseD_b:
          snprintf(buf,buflen,"OID - output buffer is too small");
LAB_0011fcfa:
          if (0x56 < uVar4) {
            if (0x6f < uVar4) {
              switch(uVar4) {
              case 0x70:
                goto switchD_0011f645_caseD_70;
              default:
                goto switchD_0011ff15_caseD_32;
              case 0x72:
                goto switchD_0011f645_caseD_72;
              case 0x73:
                goto code_r0x0011ffa0;
              case 0x74:
                goto switchD_0011f645_caseD_74;
              case 0x75:
                goto switchD_0011f645_caseD_75;
              }
            }
            goto LAB_0011fd23;
          }
          switch(uVar4) {
          case 0x30:
            goto switchD_0011f92e_caseD_30;
          case 0x31:
            goto switchD_0011ff15_caseD_31;
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x36:
          case 0x38:
            goto switchD_0011ff15_caseD_32;
          case 0x35:
            goto switchD_0011ff15_caseD_35;
          case 0x37:
            goto switchD_0011ff15_caseD_37;
          case 0x39:
            goto switchD_0011ff15_caseD_39;
          default:
            goto switchD_0011ff15_default;
          }
        }
        if (uVar4 == 0x2e) goto switchD_0011f92e_caseD_2e;
        if (uVar4 != 0x30) break;
        goto switchD_0011f92e_caseD_30;
      }
      if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
      if (uVar4 == 0x70) goto switchD_0011f645_caseD_70;
      if (uVar4 == 0x72) goto switchD_0011f645_caseD_72;
      break;
    case 0x30:
switchD_0011f92e_caseD_30:
      snprintf(buf,buflen,"PADLOCK - Input data should be aligned");
LAB_0011fd63:
      if (0x58 < uVar4) {
        switch(uVar4) {
        case 0x70:
          goto switchD_0011f645_caseD_70;
        case 0x71:
          goto switchD_0011ff15_caseD_32;
        case 0x72:
          goto switchD_0011f645_caseD_72;
        case 0x73:
          goto code_r0x0011ffa0;
        case 0x74:
          goto switchD_0011f645_caseD_74;
        case 0x75:
          goto switchD_0011f645_caseD_75;
        default:
          goto switchD_0011f601_default;
        }
      }
      if (0x30 < uVar4) {
        switch(uVar4) {
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x36:
        case 0x38:
          goto switchD_0011ff15_caseD_32;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x39:
          goto switchD_0011ff15_caseD_39;
        default:
          goto switchD_0011f433_default;
        }
      }
      goto switchD_0011ff15_default;
    case 0x31:
      goto switchD_0011ff15_caseD_31;
    case 0x32:
switchD_0011f497_caseD_32:
      snprintf(buf,buflen,"DES - The data input has an invalid length");
      switch(uVar4) {
      case 0x33:
        goto switchD_0011f497_caseD_33;
      case 0x34:
      case 0x35:
      case 0x36:
      case 0x37:
      case 0x38:
      case 0x39:
      case 0x3a:
      case 0x3b:
        break;
      case 0x3c:
        goto switchD_0011f497_caseD_3c;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3e:
        goto switchD_0011f497_caseD_3e;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      case 0x40:
        goto switchD_0011f497_caseD_40;
      default:
        if (uVar4 == 1) goto switchD_0011f61e_caseD_1;
        if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
      }
switchD_0011f4c8_caseD_34:
      if (uVar4 < 0x57) {
        switch(uVar4) {
        case 0x28:
          goto switchD_0011f92e_caseD_28;
        case 0x29:
          goto switchD_0011f92e_caseD_29;
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x36:
        case 0x38:
          goto switchD_0011ff15_caseD_32;
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x39:
          goto switchD_0011ff15_caseD_39;
        default:
          switch(uVar4) {
          case 3:
            goto switchD_0011f972_caseD_3;
          default:
            goto switchD_0011ff15_caseD_32;
          case 5:
            goto switchD_0011f972_caseD_5;
          case 7:
            goto switchD_0011f972_caseD_7;
          case 9:
            goto switchD_0011f972_caseD_9;
          case 0xb:
            goto switchD_0011f972_caseD_b;
          case 0x12:
            goto switchD_0011f972_caseD_12;
          case 0x13:
            goto switchD_0011f972_caseD_13;
          case 0x14:
            goto switchD_0011f972_caseD_14;
          }
        }
      }
      if (0x6f < uVar4) {
        if (uVar4 - 0x70 < 6) {
          (*(code *)(&DAT_0013bb90 + *(int *)(&DAT_0013bb90 + (ulong)(uVar4 - 0x70) * 4)))();
          return;
        }
        goto switchD_0011ff15_caseD_32;
      }
LAB_0011fd23:
      if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
      goto switchD_0011f601_default;
    case 0x33:
switchD_0011f497_caseD_33:
      snprintf(buf,buflen,"DES - DES hardware accelerator failed");
switchD_0011f333_caseD_35:
      if (uVar4 < 0x57) {
        switch(uVar4) {
        case 0x28:
          goto switchD_0011f92e_caseD_28;
        case 0x29:
          goto switchD_0011f92e_caseD_29;
        case 0x2a:
        case 0x2b:
        case 0x2c:
        case 0x2d:
        case 0x32:
        case 0x33:
        case 0x34:
        case 0x36:
        case 0x38:
        case 0x3a:
        case 0x3b:
          goto switchD_0011ff15_caseD_32;
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x39:
          goto switchD_0011ff15_caseD_39;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          switch(uVar4) {
          case 1:
            goto switchD_0011f61e_caseD_1;
          default:
            goto switchD_0011ff15_caseD_32;
          case 3:
            goto switchD_0011f972_caseD_3;
          case 5:
            goto switchD_0011f972_caseD_5;
          case 7:
            goto switchD_0011f972_caseD_7;
          case 9:
            goto switchD_0011f972_caseD_9;
          case 0xb:
            goto switchD_0011f972_caseD_b;
          case 0x12:
            goto switchD_0011f972_caseD_12;
          case 0x13:
            goto switchD_0011f972_caseD_13;
          case 0x14:
            goto switchD_0011f972_caseD_14;
          }
        }
      }
      if (0x6d < uVar4) {
        switch(uVar4) {
        case 0x6e:
          goto switchD_0011f645_caseD_6e;
        default:
          goto switchD_0011ff15_caseD_32;
        case 0x70:
          goto switchD_0011f645_caseD_70;
        case 0x72:
          goto switchD_0011f645_caseD_72;
        case 0x73:
          goto code_r0x0011ffa0;
        case 0x74:
          goto switchD_0011f645_caseD_74;
        case 0x75:
          goto switchD_0011f645_caseD_75;
        }
      }
      goto LAB_0011fd23;
    case 0x34:
switchD_0011e70c_caseD_32:
      snprintf(buf,buflen,"CTR_DRBG - The entropy source failed");
code_r0x0011f352:
      switch(uVar4) {
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x32:
        goto switchD_0011f497_caseD_32;
      case 0x33:
        goto switchD_0011f497_caseD_33;
      case 0x34:
      case 0x39:
      case 0x3b:
      case 0x41:
      case 0x42:
      case 0x43:
      case 0x44:
      case 0x45:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
      case 0x4c:
      case 0x4d:
      case 0x4e:
      case 0x4f:
      case 0x50:
      case 0x51:
      case 0x52:
      case 0x53:
      case 0x54:
      case 0x55:
      case 0x56:
      case 0x58:
      case 0x5a:
        goto switchD_0011f360_caseD_34;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x36:
        goto switchD_0011e70c_caseD_34;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x38:
        goto switchD_0011e70c_caseD_36;
      case 0x3a:
        goto switchD_0011e70c_caseD_38;
      case 0x3c:
        goto switchD_0011f497_caseD_3c;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3e:
        goto switchD_0011f497_caseD_3e;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      case 0x40:
        goto switchD_0011f497_caseD_40;
      case 0x57:
        goto switchD_0011f39a_caseD_57;
      case 0x59:
        goto switchD_0011f39a_caseD_59;
      case 0x5b:
        goto switchD_0011f39a_caseD_5b;
      default:
        switch(uVar4) {
        case 1:
          goto switchD_0011f61e_caseD_1;
        case 2:
        case 4:
        case 6:
        case 8:
        case 10:
        case 0xc:
        case 0xd:
        case 0xe:
        case 0xf:
        case 0x10:
        case 0x11:
          goto switchD_0011f360_caseD_34;
        case 3:
          goto switchD_0011f972_caseD_3;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        case 0x12:
          goto switchD_0011f972_caseD_12;
        case 0x13:
          goto switchD_0011f972_caseD_13;
        case 0x14:
          goto switchD_0011f972_caseD_14;
        default:
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          default:
            goto switchD_0011f360_caseD_34;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          }
        }
      }
    case 0x35:
      goto switchD_0011ff15_caseD_35;
    case 0x36:
switchD_0011e70c_caseD_34:
      snprintf(buf,buflen,"CTR_DRBG - The requested random buffer length is too big");
switchD_0011f12b_caseD_52:
      if (uVar4 < 0x57) {
        switch(uVar4) {
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
          goto switchD_0011ff15_caseD_31;
        case 0x32:
          goto switchD_0011f497_caseD_32;
        case 0x33:
          goto switchD_0011f497_caseD_33;
        case 0x34:
        case 0x36:
        case 0x39:
        case 0x3b:
          break;
        case 0x35:
          goto switchD_0011ff15_caseD_35;
        case 0x37:
          goto switchD_0011ff15_caseD_37;
        case 0x38:
          goto switchD_0011e70c_caseD_36;
        case 0x3a:
          goto switchD_0011e70c_caseD_38;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          switch(uVar4) {
          case 1:
            goto switchD_0011f61e_caseD_1;
          case 3:
            goto switchD_0011f972_caseD_3;
          case 5:
            goto switchD_0011f972_caseD_5;
          case 7:
            goto switchD_0011f972_caseD_7;
          case 9:
            goto switchD_0011f972_caseD_9;
          case 0xb:
            goto switchD_0011f972_caseD_b;
          case 0x12:
            goto switchD_0011f972_caseD_12;
          case 0x13:
            goto switchD_0011f972_caseD_13;
          case 0x14:
            goto switchD_0011f972_caseD_14;
          }
        }
      }
      else {
        if (0x6d < uVar4) {
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          default:
            goto switchD_0011f3db_caseD_6f;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          }
        }
        if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
        if (uVar4 == 0x59) goto switchD_0011f39a_caseD_59;
        if (uVar4 == 0x5b) goto switchD_0011f39a_caseD_5b;
      }
      goto switchD_0011f3db_caseD_6f;
    case 0x37:
    case 0x39:
    case 0x3b:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x58:
    case 0x5a:
      goto switchD_0011f39a_caseD_37;
    case 0x38:
switchD_0011e70c_caseD_36:
      snprintf(buf,buflen,"CTR_DRBG - The input (entropy + additional data) is too large");
LAB_0011f40e:
      if (0x58 < uVar4) {
        switch(uVar4) {
        case 0x6e:
          goto switchD_0011f645_caseD_6e;
        case 0x6f:
        case 0x71:
          goto switchD_0011ff15_caseD_32;
        case 0x70:
          goto switchD_0011f645_caseD_70;
        case 0x72:
          goto switchD_0011f645_caseD_72;
        case 0x73:
          goto code_r0x0011ffa0;
        case 0x74:
          goto switchD_0011f645_caseD_74;
        case 0x75:
          goto switchD_0011f645_caseD_75;
        default:
          goto switchD_0011f601_default;
        }
      }
      switch(uVar4) {
      case 1:
        goto switchD_0011f61e_caseD_1;
      case 2:
      case 4:
      case 6:
      case 8:
      case 10:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x19:
      case 0x1a:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x1f:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x34:
      case 0x36:
      case 0x38:
      case 0x3b:
        goto switchD_0011ff15_caseD_32;
      case 3:
        goto switchD_0011f972_caseD_3;
      case 5:
        goto switchD_0011f972_caseD_5;
      case 7:
        goto switchD_0011f972_caseD_7;
      case 9:
        goto switchD_0011f972_caseD_9;
      case 0xb:
        goto switchD_0011f972_caseD_b;
      case 0x12:
        goto switchD_0011f972_caseD_12;
      case 0x13:
        goto switchD_0011f972_caseD_13;
      case 0x14:
        goto switchD_0011f972_caseD_14;
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x32:
        goto switchD_0011f497_caseD_32;
      case 0x33:
        goto switchD_0011f497_caseD_33;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      case 0x3a:
        goto switchD_0011e70c_caseD_38;
      case 0x3c:
        goto switchD_0011f497_caseD_3c;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3e:
        goto switchD_0011f497_caseD_3e;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      case 0x40:
        goto switchD_0011f497_caseD_40;
      }
switchD_0011f433_default:
      if (uVar4 != 0x57) goto switchD_0011ff15_caseD_32;
    case 0x57:
switchD_0011f39a_caseD_57:
      snprintf(buf,buflen,"POLY1305 - Invalid input parameter(s)");
      break;
    case 0x3a:
switchD_0011e70c_caseD_38:
      snprintf(buf,buflen,"CTR_DRBG - Read or write error in file");
switchD_0011e70c_caseD_1:
      if (uVar4 < 0x57) {
        switch(uVar4) {
        case 0x2e:
          goto switchD_0011f92e_caseD_2e;
        case 0x2f:
          goto switchD_0011f92e_caseD_2f;
        case 0x30:
          goto switchD_0011f92e_caseD_30;
        case 0x31:
        case 0x34:
        case 0x35:
        case 0x36:
        case 0x37:
        case 0x38:
        case 0x39:
        case 0x3a:
        case 0x3b:
          break;
        case 0x32:
          goto switchD_0011f497_caseD_32;
        case 0x33:
          goto switchD_0011f497_caseD_33;
        case 0x3c:
          goto switchD_0011f497_caseD_3c;
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          switch(uVar4) {
          case 1:
            goto switchD_0011f61e_caseD_1;
          case 3:
            goto switchD_0011f972_caseD_3;
          case 5:
            goto switchD_0011f972_caseD_5;
          case 7:
            goto switchD_0011f972_caseD_7;
          case 9:
            goto switchD_0011f972_caseD_9;
          case 0xb:
            goto switchD_0011f972_caseD_b;
          case 0x12:
            goto switchD_0011f972_caseD_12;
          case 0x13:
            goto switchD_0011f972_caseD_13;
          case 0x14:
            goto switchD_0011f972_caseD_14;
          }
        }
      }
      else if (uVar4 < 0x6e) {
        if (uVar4 == 0x57) goto switchD_0011f39a_caseD_57;
        if (uVar4 == 0x59) goto switchD_0011f39a_caseD_59;
        if (uVar4 == 0x5b) goto switchD_0011f39a_caseD_5b;
      }
      else {
        if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
        if (uVar4 == 0x70) goto switchD_0011f645_caseD_70;
        if (uVar4 == 0x72) goto switchD_0011f645_caseD_72;
      }
      goto switchD_0011f497_caseD_31;
    case 0x3c:
switchD_0011f497_caseD_3c:
      snprintf(buf,buflen,"ENTROPY - Critical entropy source failure");
      if (0x3c < uVar4) {
        switch(uVar4) {
        case 0x3d:
          goto switchD_0011f497_caseD_3d;
        case 0x3e:
          goto switchD_0011f497_caseD_3e;
        case 0x3f:
          goto switchD_0011f497_caseD_3f;
        case 0x40:
          goto switchD_0011f497_caseD_40;
        default:
          if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
        }
        goto LAB_0011f9c9;
      }
LAB_0011f5c3:
      if (uVar4 != 1) {
        if (uVar4 == 0x12) goto switchD_0011f972_caseD_12;
        if (uVar4 == 0x13) goto switchD_0011f972_caseD_13;
        goto LAB_0011f9c9;
      }
switchD_0011f61e_caseD_1:
      snprintf(buf,buflen,"ERROR - Generic error");
      if (uVar4 < 0x12) {
        if (uVar4 == 3) goto switchD_0011f972_caseD_3;
        if (uVar4 == 5) goto switchD_0011f972_caseD_5;
        if (uVar4 == 7) goto switchD_0011f972_caseD_7;
      }
      else if (uVar4 < 0x14) {
        if (uVar4 == 0x12) goto switchD_0011f972_caseD_12;
        if (uVar4 == 0x13) goto switchD_0011f972_caseD_13;
      }
      else {
        if (uVar4 == 0x14) goto switchD_0011f972_caseD_14;
        if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
      }
LAB_0011fb09:
      if (0x56 < uVar4) {
        if (0x6f < uVar4) {
          switch(uVar4) {
          case 0x70:
            goto switchD_0011f645_caseD_70;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x36:
      case 0x38:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      default:
        if (uVar4 == 9) goto switchD_0011f972_caseD_9;
      }
      goto switchD_0011fbdf_default;
    case 0x3d:
switchD_0011f497_caseD_3d:
      snprintf(buf,buflen,"ENTROPY - No strong sources have been added to poll");
switchD_0011edbd_caseD_25:
      if (0x56 < uVar4) {
        if (0x6d < uVar4) {
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x36:
      case 0x38:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      default:
        switch(uVar4) {
        case 1:
          goto switchD_0011f61e_caseD_1;
        default:
          goto switchD_0011ff15_caseD_32;
        case 3:
          goto switchD_0011f972_caseD_3;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        case 0x12:
          goto switchD_0011f972_caseD_12;
        case 0x13:
          goto switchD_0011f972_caseD_13;
        case 0x14:
          goto switchD_0011f972_caseD_14;
        }
      }
    case 0x3e:
switchD_0011f497_caseD_3e:
      snprintf(buf,buflen,"ENTROPY - No more sources can be added");
      if (uVar4 < 0x3d) goto LAB_0011f5c3;
      if (uVar4 < 0x40) {
        if (uVar4 == 0x3d) goto switchD_0011f497_caseD_3d;
        if (uVar4 == 0x3f) goto switchD_0011f497_caseD_3f;
      }
      else {
        if (uVar4 == 0x6e) goto switchD_0011f645_caseD_6e;
        if (uVar4 == 0x40) goto switchD_0011f497_caseD_40;
      }
LAB_0011f9c9:
      if (0x56 < uVar4) {
        if (0x6f < uVar4) {
          switch(uVar4) {
          case 0x70:
            goto switchD_0011f645_caseD_70;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x36:
      case 0x38:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      default:
        switch(uVar4) {
        case 3:
          goto switchD_0011f972_caseD_3;
        case 4:
        case 6:
        case 8:
        case 10:
          goto switchD_0011ff15_caseD_32;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        default:
          if (uVar4 != 0x14) goto switchD_0011ff15_caseD_32;
          goto switchD_0011f972_caseD_14;
        }
      }
    case 0x3f:
switchD_0011f497_caseD_3f:
      snprintf(buf,buflen,"ENTROPY - Read/write error in file");
switchD_0011ee57_caseD_25:
      if (0x56 < uVar4) {
        if (0x6d < uVar4) {
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      if (uVar4 - 1 < 0x14) {
        (*(code *)(&DAT_0013ba48 + *(int *)(&DAT_0013ba48 + (ulong)(uVar4 - 1) * 4)))();
        return;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      default:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      }
    case 0x40:
switchD_0011f497_caseD_40:
      snprintf(buf,buflen,"ENTROPY - No sources have been added to poll");
switchD_0011ed3c_caseD_25:
      if (0x56 < uVar4) {
        if (0x6d < uVar4) {
          switch(uVar4) {
          case 0x6e:
            goto switchD_0011f645_caseD_6e;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x70:
            goto switchD_0011f645_caseD_70;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x36:
      case 0x38:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3e:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      case 0x3d:
        goto switchD_0011f497_caseD_3d;
      case 0x3f:
        goto switchD_0011f497_caseD_3f;
      default:
        switch(uVar4) {
        case 1:
          goto switchD_0011f61e_caseD_1;
        default:
          goto switchD_0011ff15_caseD_32;
        case 3:
          goto switchD_0011f972_caseD_3;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        case 0xb:
          goto switchD_0011f972_caseD_b;
        case 0x12:
          goto switchD_0011f972_caseD_12;
        case 0x13:
          goto switchD_0011f972_caseD_13;
        case 0x14:
          goto switchD_0011f972_caseD_14;
        }
      }
    case 0x59:
      goto switchD_0011f39a_caseD_59;
    case 0x5b:
      goto switchD_0011f39a_caseD_5b;
    default:
      switch(uVar4) {
      case 1:
        goto switchD_0011f61e_caseD_1;
      default:
        goto switchD_0011f39a_caseD_37;
      case 3:
switchD_0011f972_caseD_3:
        snprintf(buf,buflen,"HMAC_DRBG - Too many random requested in single call");
        if (uVar4 - 5 < 7) {
          (*(code *)(&DAT_0013bc64 + *(int *)(&DAT_0013bc64 + (ulong)(uVar4 - 5) * 4)))();
          return;
        }
        if (uVar4 == 0x2e) goto switchD_0011f92e_caseD_2e;
        if (uVar4 == 0x2f) goto switchD_0011f92e_caseD_2f;
        goto LAB_0011fcfa;
      case 5:
switchD_0011f972_caseD_5:
        snprintf(buf,buflen,"HMAC_DRBG - Input too large (Entropy + additional)");
        if (0x2d < uVar4) {
          if (uVar4 == 0x2e) goto switchD_0011f92e_caseD_2e;
          if (uVar4 == 0x2f) goto switchD_0011f92e_caseD_2f;
          if (uVar4 != 0x30) goto LAB_0011fd63;
          goto switchD_0011f92e_caseD_30;
        }
        if (uVar4 == 7) goto switchD_0011f972_caseD_7;
        if (uVar4 == 9) goto switchD_0011f972_caseD_9;
        if (uVar4 == 0xb) goto switchD_0011f972_caseD_b;
        goto LAB_0011fd63;
      case 7:
switchD_0011f972_caseD_7:
        snprintf(buf,buflen,"HMAC_DRBG - Read/write error in file");
        goto LAB_0011fb09;
      case 9:
switchD_0011f972_caseD_9:
        snprintf(buf,buflen,"HMAC_DRBG - The entropy source failed");
        break;
      case 0xb:
        goto switchD_0011f972_caseD_b;
      case 0x12:
switchD_0011f972_caseD_12:
        snprintf(buf,buflen,"GCM - Authenticated decryption failed");
        switch(uVar4) {
        case 3:
          goto switchD_0011f972_caseD_3;
        case 4:
        case 6:
        case 8:
          break;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        default:
          if (uVar4 == 0x14) goto switchD_0011f972_caseD_14;
          if (uVar4 == 0x13) goto switchD_0011f972_caseD_13;
        }
        break;
      case 0x13:
switchD_0011f972_caseD_13:
        snprintf(buf,buflen,"GCM - GCM hardware accelerator failed");
        goto LAB_0011f9c9;
      case 0x14:
switchD_0011f972_caseD_14:
        snprintf(buf,buflen,"GCM - Bad input parameters to function");
        switch(uVar4) {
        case 3:
          goto switchD_0011f972_caseD_3;
        case 4:
        case 6:
        case 8:
          break;
        case 5:
          goto switchD_0011f972_caseD_5;
        case 7:
          goto switchD_0011f972_caseD_7;
        case 9:
          goto switchD_0011f972_caseD_9;
        default:
          if (uVar4 == 0x2e) goto switchD_0011f92e_caseD_2e;
          if (uVar4 == 0x2f) goto switchD_0011f92e_caseD_2f;
        }
        goto switchD_0011fa89_caseD_4;
      }
switchD_0011eeff_caseD_52:
      if (0x56 < uVar4) {
        if (0x6f < uVar4) {
          switch(uVar4) {
          case 0x70:
            goto switchD_0011f645_caseD_70;
          default:
            goto switchD_0011ff15_caseD_32;
          case 0x72:
            goto switchD_0011f645_caseD_72;
          case 0x73:
            goto code_r0x0011ffa0;
          case 0x74:
            goto switchD_0011f645_caseD_74;
          case 0x75:
            goto switchD_0011f645_caseD_75;
          }
        }
        goto LAB_0011fd23;
      }
      switch(uVar4) {
      case 0x28:
        goto switchD_0011f92e_caseD_28;
      case 0x29:
        goto switchD_0011f92e_caseD_29;
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x32:
      case 0x33:
      case 0x34:
      case 0x36:
      case 0x38:
        goto switchD_0011ff15_caseD_32;
      case 0x2e:
        goto switchD_0011f92e_caseD_2e;
      case 0x2f:
        goto switchD_0011f92e_caseD_2f;
      case 0x30:
        goto switchD_0011f92e_caseD_30;
      case 0x31:
        goto switchD_0011ff15_caseD_31;
      case 0x35:
        goto switchD_0011ff15_caseD_35;
      case 0x37:
        goto switchD_0011ff15_caseD_37;
      case 0x39:
        goto switchD_0011ff15_caseD_39;
      default:
switchD_0011fbdf_default:
        if (uVar4 != 0xb) goto switchD_0011ff15_caseD_32;
        goto switchD_0011f972_caseD_b;
      }
    }
switchD_0011e7ca_caseD_15:
    if (0x58 < uVar4) {
      if (0x72 < uVar4) {
LAB_0011ff17:
        if (uVar4 != 0x73) goto LAB_0011ffcf;
code_r0x0011ffa0:
        snprintf(buf,buflen,"SHA1 - SHA-1 input data was malformed");
        if (0x38 < uVar4) {
          if (uVar4 == 0x39) goto switchD_0011ff15_caseD_39;
          if (uVar4 == 0x74) goto switchD_0011f645_caseD_74;
          if (uVar4 != 0x75) goto LAB_001200c6;
          goto switchD_0011f645_caseD_75;
        }
        if (uVar4 == 0x28) goto switchD_0011f92e_caseD_28;
        if (uVar4 == 0x37) goto switchD_0011ff15_caseD_37;
        goto LAB_001200c6;
      }
switchD_0011f601_default:
      if (uVar4 != 0x59) {
        if (uVar4 != 0x5b) goto switchD_0011ff15_caseD_32;
switchD_0011f39a_caseD_5b:
        snprintf(buf,buflen,"POLY1305 - Poly1305 hardware accelerator failed");
switchD_0011f497_caseD_31:
        if (uVar4 < 0x73) {
          switch(uVar4) {
          case 0x31:
            goto switchD_0011ff15_caseD_31;
          case 0x32:
          case 0x33:
          case 0x34:
          case 0x36:
          case 0x38:
            goto switchD_0011ff15_caseD_32;
          case 0x35:
            goto switchD_0011ff15_caseD_35;
          case 0x37:
            goto switchD_0011ff15_caseD_37;
          case 0x39:
            goto switchD_0011ff15_caseD_39;
          }
          goto switchD_0011ff15_default;
        }
        goto LAB_0011ff17;
      }
switchD_0011f39a_caseD_59:
      snprintf(buf,buflen,
               "POLY1305 - Feature not available. For example, s part of the API is not implemented"
              );
      if (0x36 < uVar4) {
        if (uVar4 == 0x37) goto switchD_0011ff15_caseD_37;
        if (uVar4 != 0x73) {
          if (uVar4 == 0x5b) goto switchD_0011f39a_caseD_5b;
          goto switchD_0011f360_caseD_34;
        }
        goto code_r0x0011ffa0;
      }
      if (uVar4 == 0x31) goto switchD_0011ff15_caseD_31;
      if (uVar4 == 0x35) goto switchD_0011ff15_caseD_35;
switchD_0011f360_caseD_34:
      if (uVar4 < 0x39) goto switchD_0011ff15_default;
      if (uVar4 == 0x39) goto switchD_0011ff15_caseD_39;
      if (uVar4 != 0x75) {
        if (uVar4 != 0x74) goto switchD_0011ff15_caseD_32;
        goto switchD_0011f645_caseD_74;
      }
      goto switchD_0011f645_caseD_75;
    }
    switch(uVar4) {
    case 0x31:
switchD_0011ff15_caseD_31:
      snprintf(buf,buflen,"RIPEMD160 - RIPEMD160 hardware accelerator failed");
LAB_0011ff48:
      if (0x38 < uVar4) goto LAB_0011ff7c;
      if (0x34 < uVar4) {
        if (uVar4 == 0x35) goto switchD_0011ff15_caseD_35;
LAB_0011ffef:
        if (uVar4 != 0x37) goto switchD_0011ff15_caseD_32;
        goto switchD_0011ff15_caseD_37;
      }
      break;
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x36:
    case 0x38:
      goto switchD_0011ff15_caseD_32;
    case 0x35:
switchD_0011ff15_caseD_35:
      snprintf(buf,buflen,"SHA1 - SHA-1 hardware accelerator failed");
switchD_0011f39a_caseD_37:
      if (uVar4 < 0x39) {
        if (uVar4 == 0x28) goto switchD_0011f92e_caseD_28;
        if (uVar4 != 0x29) goto LAB_0011ffef;
        goto switchD_0011f92e_caseD_29;
      }
LAB_0011ff7c:
      if (uVar4 < 0x74) {
        if (uVar4 != 0x39) {
          if (uVar4 != 0x73) goto switchD_0011ff15_caseD_32;
          goto code_r0x0011ffa0;
        }
        goto switchD_0011ff15_caseD_39;
      }
LAB_0011ffcf:
      if (uVar4 == 0x74) {
switchD_0011f645_caseD_74:
        snprintf(buf,buflen,"SHA256 - SHA-256 input data was malformed");
switchD_0011f3db_caseD_6f:
        if (0x38 < uVar4) {
          if (uVar4 == 0x75) goto switchD_0011f645_caseD_75;
          if (uVar4 != 0x39) goto switchD_0011ff15_caseD_32;
          goto switchD_0011ff15_caseD_39;
        }
        break;
      }
      goto LAB_0012008c;
    case 0x37:
switchD_0011ff15_caseD_37:
      snprintf(buf,buflen,"SHA256 - SHA-256 hardware accelerator failed");
      goto switchD_0011f360_caseD_34;
    case 0x39:
      goto switchD_0011ff15_caseD_39;
    }
switchD_0011ff15_default:
    if (uVar4 == 0x28) goto switchD_0011f92e_caseD_28;
    goto LAB_001200c6;
  }
  if (0x4e7f < uVar3) {
    if (uVar3 < 0x6080) {
      if (uVar3 < 0x5100) {
        if (uVar3 < 0x4f80) {
          if (uVar3 == 0x4e80) goto switchD_0011b75c_caseD_4;
          if (uVar3 != 0x4f00) goto LAB_0011e269;
          goto switchD_0011b75c_caseD_5;
        }
        if (uVar3 == 0x4f80) goto switchD_0011b701_caseD_5;
        if (uVar3 != 0x5080) goto LAB_0011e269;
LAB_0011c51a:
        snprintf(buf,buflen,"MD - The selected feature is not available");
        if (uVar3 < 0x1280) {
LAB_0011c61d:
          if (uVar3 < 0x1180) {
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          }
          else {
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
            if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
          }
        }
        else if (uVar3 < 0x5180) {
          if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          if (uVar3 == 0x5100) goto LAB_0011c600;
        }
        else {
          if (uVar3 == 0x5180) goto LAB_0011c670;
LAB_0011c700:
          if (uVar3 == 0x5200) goto LAB_0011c8bf;
          if (uVar3 == 0x5280) goto LAB_0011c946;
        }
LAB_0011ccce:
        if (uVar3 < 0x3a80) {
          if (uVar3 < 0x2e00) {
            if (uVar3 < 0x1e00) {
              if (uVar3 < 0x1400) {
LAB_0011ccfe:
                if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
                if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
              }
              else {
                if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
                if (uVar3 == 0x1480) goto LAB_0011d5c6;
              }
            }
            else if (uVar3 < 0x1f00) {
              if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
              if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
            }
            else {
              if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
              if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
            }
          }
          else if (uVar3 < 0x3880) {
            if (uVar3 < 0x2f00) {
LAB_0011cdef:
              if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
              if (uVar3 == 0x2e80) goto switchD_0011d89b_caseD_21;
            }
            else {
              if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
              if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
            }
          }
          else if (uVar3 < 0x3980) {
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
          }
          else {
LAB_0011d019:
            if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
            if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
          }
        }
        else if (uVar3 < 16000) {
          if (uVar3 < 0x3c80) {
            if (uVar3 < 0x3b80) {
LAB_0011cd44:
              if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
              if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
            }
            else {
              if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
              if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
            }
          }
          else if (uVar3 < 0x3d80) {
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
            if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
          }
          else {
            if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
            if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          }
        }
        else if (uVar3 < 0x4100) {
          if (uVar3 < 0x3f80) {
LAB_0011ce28:
            if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
            if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          }
          else {
LAB_0011d038:
            if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
            if (uVar3 == 0x4080) goto switchD_0011d89b_caseD_45;
          }
        }
        else if (uVar3 < 0x4200) {
          if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
          if (uVar3 == 0x4180) goto switchD_0011e416_caseD_1;
        }
        else {
          if (uVar3 == 0x4200) goto switchD_0011e522_caseD_0;
          if (uVar3 == 0x4280) goto switchD_0011e55a_caseD_0;
        }
        goto LAB_0011e570;
      }
      if (0x51ff < uVar3) {
        if (uVar3 == 0x5200) {
LAB_0011c8bf:
          snprintf(buf,buflen,"MD - Opening or reading of file failed");
          if (uVar3 < 0x1200) {
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
          }
          else if (uVar3 < 0x1300) {
            if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
            if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          }
          else {
            if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
            if (uVar3 == 0x5280) goto LAB_0011c946;
          }
          goto LAB_0011d13c;
        }
        if (uVar3 != 0x5280) goto LAB_0011e269;
LAB_0011c946:
        snprintf(buf,buflen,"MD - MD hardware accelerator failed");
        switch(uVar3 - 0x1080 >> 7) {
        case 0:
switchD_0011c97c_caseD_0:
          snprintf(buf,buflen,"PEM - No PEM header or footer found");
          goto LAB_0011c992;
        case 1:
switchD_0011c97c_caseD_1:
          snprintf(buf,buflen,"PEM - PEM string is not as expected");
          switch(uVar3 - 0x1180 >> 7) {
          case 0:
            goto switchD_0011cc10_caseD_0;
          case 1:
            goto switchD_0011cc10_caseD_1;
          case 2:
            goto switchD_0011cc10_caseD_2;
          case 3:
            goto switchD_0011cc10_caseD_3;
          case 4:
            goto switchD_0011cc10_caseD_4;
          case 5:
            goto switchD_0011cc10_caseD_5;
          default:
            goto switchD_0011cc10_default;
          }
        case 2:
switchD_0011cc10_caseD_0:
          snprintf(buf,buflen,"PEM - Failed to allocate memory");
          goto LAB_0011cc26;
        case 3:
          goto switchD_0011cc10_caseD_1;
        case 4:
          goto switchD_0011cc10_caseD_2;
        case 5:
          goto switchD_0011cc10_caseD_3;
        case 6:
          goto switchD_0011cc10_caseD_4;
        default:
          goto switchD_0011c97c_default;
        }
      }
      if (uVar3 == 0x5100) {
LAB_0011c600:
        snprintf(buf,buflen,"MD - Bad input parameters to function");
        if (uVar3 < 0x1280) goto LAB_0011c61d;
        if (0x51ff < uVar3) goto LAB_0011c700;
        if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
        if (uVar3 != 0x5180) goto LAB_0011ccce;
      }
      else if (uVar3 != 0x5180) goto LAB_0011e269;
LAB_0011c670:
      snprintf(buf,buflen,"MD - Failed to allocate memory");
      if (uVar3 < 0x1280) {
        if (uVar3 < 0x1180) {
          if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
          if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
        }
        else {
          if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
          if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
        }
      }
      else if (uVar3 < 0x5200) {
        if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
        if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
      }
      else {
        if (uVar3 == 0x5280) goto LAB_0011c946;
        if (uVar3 == 0x5200) goto LAB_0011c8bf;
      }
LAB_0011d13c:
      if (uVar3 < 0x3b00) {
        if (uVar3 < 0x2e80) {
          if (uVar3 < 0x1e80) {
            if (uVar3 < 0x1480) {
              if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
              if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
            }
            else {
              if (uVar3 == 0x1480) goto LAB_0011d5c6;
              if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
            }
          }
          else if (uVar3 < 0x1f80) {
            if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
            if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
          }
          else {
            if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
            if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
          }
        }
        else if (uVar3 < 0x3900) {
          if (uVar3 < 0x2f80) {
            if (uVar3 == 0x2e80) goto switchD_0011d89b_caseD_21;
            if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
          }
          else {
            if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
          }
        }
        else if (uVar3 < 0x3a00) {
          if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
          if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
        }
        else {
          if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
        }
      }
      else if (uVar3 < 0x3f00) {
        if (uVar3 < 0x3d00) {
          if (uVar3 < 0x3c00) {
            if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
            if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
          }
          else {
            if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
          }
        }
        else if (uVar3 < 0x3e00) {
          if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
          if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
        }
        else {
          if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        }
      }
      else if (uVar3 < 0x4180) {
        if (uVar3 < 0x4080) {
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
        }
        else {
          if (uVar3 == 0x4080) goto switchD_0011d89b_caseD_45;
          if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
        }
      }
      else if (uVar3 < 0x4280) {
        if (uVar3 == 0x4180) goto switchD_0011e416_caseD_1;
        if (uVar3 == 0x4200) goto switchD_0011e522_caseD_0;
      }
      else {
        if (uVar3 == 0x4280) goto switchD_0011e55a_caseD_0;
        if (uVar3 == 0x4300) goto switchD_0011e55a_caseD_1;
      }
LAB_0011e5a8:
      switch(uVar3 - 0x4380 >> 7) {
      case 0:
        goto switchD_0011e55a_caseD_2;
      case 1:
switchD_0011e55a_caseD_3:
        snprintf(buf,buflen,"RSA - The output buffer for decryption is not large enough");
        goto LAB_0011e618;
      case 2:
        goto switchD_0011e55a_caseD_4;
      case 3:
        goto switchD_0011e522_caseD_6;
      case 4:
        goto switchD_0011e522_caseD_7;
      default:
        goto switchD_0011e522_default;
      }
    }
    if (0x627f < uVar3) {
      if (uVar3 < 0x6380) {
        if (uVar3 != 0x6280) {
          if (uVar3 != 0x6300) goto LAB_0011e269;
          snprintf(buf,buflen,"CIPHER - Authentication failed (for AEAD modes)");
          goto LAB_0011bc47;
        }
        snprintf(buf,buflen,"CIPHER - Decryption of block requires a full block");
        goto switchD_0011b75c_default;
      }
      if (uVar3 != 0x6380) {
        if (uVar3 != 0x6400) goto LAB_0011e269;
        snprintf(buf,buflen,"CIPHER - Cipher hardware accelerator failed");
LAB_0011b495:
        if (0x4eff < uVar3) {
LAB_0011b4bd:
          if (uVar3 != 0x4f00) {
            if (uVar3 != 0x4f80) goto LAB_0011b7d5;
            goto switchD_0011b701_caseD_5;
          }
          goto switchD_0011b75c_caseD_5;
        }
        if (uVar3 == 0x3580) goto LAB_0011b6cb;
        if (uVar3 != 0x4e80) goto LAB_0011b7d5;
        goto switchD_0011b75c_caseD_4;
      }
      snprintf(buf,buflen,"CIPHER - The context is invalid. For example, because it was freed");
LAB_0011ba84:
      if (uVar3 < 0x3f00) {
        if (uVar3 < 0x1380) {
          if (uVar3 < 0x1200) {
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
          }
          else {
            if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
            if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
            if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
          }
        }
        else if (uVar3 < 0x3d80) {
          if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
          if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
          if (uVar3 == 0x1480) goto LAB_0011d5c6;
        }
        else {
          if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
          if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        }
        goto LAB_0011da5a;
      }
      if (uVar3 < 0x4d00) {
        if (uVar3 < 0x4b80) {
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
          if (uVar3 == 0x4b00) goto LAB_0011c45b;
        }
        else {
          if (uVar3 == 0x4b80) goto LAB_0011c3a8;
          if (uVar3 == 0x4c00) goto LAB_0011c357;
          if (uVar3 == 0x4c80) goto switchD_0011b75c_caseD_0;
        }
        goto LAB_0011da5a;
      }
      if (0x50ff < uVar3) {
        if (uVar3 < 0x5200) {
          if (uVar3 == 0x5100) goto LAB_0011c600;
          if (uVar3 == 0x5180) goto LAB_0011c670;
        }
        else {
          if (uVar3 == 0x5200) goto LAB_0011c8bf;
          if (uVar3 == 0x5280) goto LAB_0011c946;
        }
        goto LAB_0011da5a;
      }
      if (uVar3 != 0x4d00) {
        if (uVar3 == 0x4d80) goto switchD_0011b75c_caseD_2;
        if (uVar3 == 0x5080) goto LAB_0011c51a;
        goto LAB_0011da5a;
      }
switchD_0011b75c_caseD_1:
      snprintf(buf,buflen,"ECP - Generation of random value, such as ephemeral key, failed");
switchD_0011b701_default:
      if (uVar3 < 0x3a80) {
        if (uVar3 < 0x1e80) {
          if (uVar3 < 0x1300) {
            if (uVar3 < 0x1180) {
              if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
              if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
            }
            else {
              if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
              if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
              if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
            }
          }
          else if (uVar3 < 0x1400) {
            if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
            if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
          }
          else {
            if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
            if (uVar3 == 0x1480) goto LAB_0011d5c6;
            if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
          }
          goto LAB_0011e3f4;
        }
        if (0x2eff < uVar3) {
          if (uVar3 < 0x3900) {
            if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
            if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
          }
          else {
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
            if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
            if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
          }
          goto LAB_0011e3f4;
        }
        if (uVar3 < 0x1f80) {
          if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
          if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
          goto LAB_0011e3f4;
        }
        if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
        goto LAB_0011e1b0;
      }
      if (0x3f7f < uVar3) {
        if (0x4c7f < uVar3) {
          if (uVar3 < 0x5180) {
            if (uVar3 == 0x4c80) goto switchD_0011b75c_caseD_0;
            if (uVar3 == 0x5080) goto LAB_0011c51a;
            if (uVar3 == 0x5100) goto LAB_0011c600;
          }
          else {
            if (uVar3 == 0x5180) goto LAB_0011c670;
            if (uVar3 == 0x5200) goto LAB_0011c8bf;
            if (uVar3 == 0x5280) goto LAB_0011c946;
          }
          goto LAB_0011e3f4;
        }
        if (0x4aff < uVar3) {
          if (uVar3 == 0x4b00) goto LAB_0011c45b;
          if (uVar3 == 0x4b80) goto LAB_0011c3a8;
          if (uVar3 == 0x4c00) goto LAB_0011c357;
          goto LAB_0011e3f4;
        }
        if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
        if (uVar3 != 0x4080) goto LAB_0011e3f4;
        goto switchD_0011d89b_caseD_45;
      }
      if (uVar3 < 0x3d00) {
        if (uVar3 < 0x3b80) {
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
          if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
        }
        else {
          if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
          if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
          if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
        }
      }
      else if (uVar3 < 0x3e00) {
        if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
        if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
      }
      else {
        if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
        if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
      }
      goto LAB_0011e3f4;
    }
    if (uVar3 < 0x6180) {
      if (uVar3 != 0x6080) {
        if (uVar3 != 0x6100) goto LAB_0011e269;
        snprintf(buf,buflen,"CIPHER - Bad input parameters");
        goto LAB_0011d879;
      }
      snprintf(buf,buflen,"CIPHER - The selected feature is not available");
      goto LAB_0011e36a;
    }
    if (uVar3 != 0x6180) {
      if (uVar3 != 0x6200) goto LAB_0011e269;
      snprintf(buf,buflen,"CIPHER - Input data contains invalid padding and is rejected");
      goto LAB_0011c46f;
    }
    snprintf(buf,buflen,"CIPHER - Failed to allocate memory");
LAB_0011c992:
    if (uVar3 < 0x3b00) {
      if (uVar3 < 0x1f00) {
        if (0x137f < uVar3) {
          if (uVar3 < 0x1480) {
            if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
            if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
            goto switchD_0011e522_default;
          }
          if (uVar3 == 0x1480) goto LAB_0011d5c6;
          goto LAB_0011e0a6;
        }
        if (uVar3 < 0x1200) {
          if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
        }
        else {
          if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
          if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
        }
        goto switchD_0011e522_default;
      }
      if (uVar3 < 0x2f80) goto LAB_0011d1c2;
      if (uVar3 < 0x3980) goto LAB_0011dd52;
      if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
LAB_0011ddaa:
      if (uVar3 != 0x3a00) {
        if (uVar3 != 0x3a80) goto switchD_0011e522_default;
        goto switchD_0011dbad_caseD_3;
      }
      goto switchD_0011dbad_caseD_2;
    }
    if (uVar3 < 0x4080) {
      if (0x3d7f < uVar3) {
        if (15999 < uVar3) {
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
          goto switchD_0011e522_default;
        }
        goto LAB_0011d58c;
      }
      if (0x3bff < uVar3) goto LAB_0011d9d8;
LAB_0011da11:
      if (uVar3 != 0x3b00) {
        if (uVar3 != 0x3b80) goto switchD_0011e522_default;
        goto switchD_0011dbad_caseD_5;
      }
      goto switchD_0011dbad_caseD_4;
    }
    if (uVar3 < 0x4300) {
      if (0x417f < uVar3) goto LAB_0011e46c;
      goto LAB_0011e38d;
    }
LAB_0011e418:
    if (uVar3 < 0x4480) {
      if (uVar3 == 0x4300) goto switchD_0011e55a_caseD_1;
LAB_0011e42e:
      if (uVar3 == 0x4380) goto switchD_0011e55a_caseD_2;
      if (uVar3 != 0x4400) goto switchD_0011e522_default;
      goto switchD_0011e55a_caseD_3;
    }
LAB_0011e44d:
    if (uVar3 == 0x4480) goto switchD_0011e55a_caseD_4;
LAB_0011e45a:
    if (uVar3 == 0x4500) goto switchD_0011e522_caseD_6;
switchD_0011d89b_caseD_4:
    if (uVar3 != 0x4580) goto switchD_0011e522_default;
    goto switchD_0011e522_caseD_7;
  }
  if (0x3f7f < uVar3) {
    if (uVar3 < 0x4c80) {
      if (uVar3 < 0x4b80) {
        if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
        if (uVar3 != 0x4b00) goto LAB_0011e269;
LAB_0011c45b:
        snprintf(buf,buflen,
                 "ECP - Operation in progress, call again with the same parameters to continue");
LAB_0011c46f:
        if (uVar3 < 0x3a80) {
          if (0x1e7f < uVar3) {
            if (0x2eff < uVar3) {
              if (uVar3 < 0x3900) {
                if (uVar3 != 0x2f00) {
                  if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
                  if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
                  goto LAB_0011e570;
                }
                goto switchD_0011d89b_caseD_22;
              }
              if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
              goto LAB_0011d019;
            }
            if (uVar3 < 0x1f80) {
              if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
              if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
              goto LAB_0011e570;
            }
            if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
            goto LAB_0011cdef;
          }
          if (0x12ff < uVar3) {
            if (0x13ff < uVar3) {
              if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
              if (uVar3 == 0x1480) goto LAB_0011d5c6;
              if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
              goto LAB_0011e570;
            }
            goto LAB_0011ccfe;
          }
          if (uVar3 < 0x1180) {
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          }
          else {
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
            if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
            if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          }
          goto LAB_0011e570;
        }
        if (uVar3 < 0x3f80) {
          if (0x3cff < uVar3) {
            if (uVar3 < 0x3e00) {
              if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
              if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
              goto LAB_0011e570;
            }
            if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
            goto LAB_0011ce28;
          }
          if (0x3b7f < uVar3) {
            if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
            if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
            goto LAB_0011e570;
          }
          goto LAB_0011cd44;
        }
        if (uVar3 < 0x4280) {
          if (uVar3 < 0x4100) goto LAB_0011d038;
          if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
          if (uVar3 == 0x4180) goto switchD_0011e416_caseD_1;
          if (uVar3 != 0x4200) goto LAB_0011e570;
          goto switchD_0011e522_caseD_0;
        }
        if (0x517f < uVar3) {
          if (uVar3 == 0x5180) goto LAB_0011c670;
          if (uVar3 == 0x5200) goto LAB_0011c8bf;
          if (uVar3 == 0x5280) goto LAB_0011c946;
          goto LAB_0011e570;
        }
        if (uVar3 != 0x4280) {
          if (uVar3 == 0x5080) goto LAB_0011c51a;
          if (uVar3 == 0x5100) goto LAB_0011c600;
          goto LAB_0011e570;
        }
        goto switchD_0011e55a_caseD_0;
      }
      if (uVar3 == 0x4b80) {
LAB_0011c3a8:
        snprintf(buf,buflen,"ECP - The ECP hardware accelerator failed");
        if (uVar3 < 0x5080) {
          if (uVar3 < 0x1180) {
LAB_0011c403:
            if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
            if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          }
          else {
            if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
            if (uVar3 == 0x4b00) goto LAB_0011c45b;
          }
        }
        else {
LAB_0011c3c5:
          if (uVar3 < 0x5180) {
            if (uVar3 == 0x5080) goto LAB_0011c51a;
            if (uVar3 == 0x5100) goto LAB_0011c600;
          }
          else {
            if (uVar3 == 0x5180) goto LAB_0011c670;
            if (uVar3 == 0x5200) goto LAB_0011c8bf;
            if (uVar3 == 0x5280) goto LAB_0011c946;
          }
        }
      }
      else {
        if (uVar3 != 0x4c00) goto LAB_0011e269;
LAB_0011c357:
        snprintf(buf,buflen,"ECP - The buffer contains a valid signature followed by more data");
        if (0x507f < uVar3) goto LAB_0011c3c5;
        if (uVar3 < 0x1180) goto LAB_0011c403;
        if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
        if (uVar3 == 0x4b00) goto LAB_0011c45b;
        if (uVar3 == 0x4b80) goto LAB_0011c3a8;
      }
LAB_0011cc26:
      if (uVar3 < 0x3980) {
        if (uVar3 < 0x1f00) {
          if (uVar3 < 0x1400) {
            if (uVar3 < 0x1300) {
              if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
              if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
            }
            else {
              if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
              if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
            }
          }
          else if (uVar3 < 0x1e00) {
            if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
            if (uVar3 == 0x1480) goto LAB_0011d5c6;
          }
          else {
            if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
            if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
          }
          goto LAB_0011e500;
        }
        if (0x2eff < uVar3) {
          if (0x387f < uVar3) {
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
            goto LAB_0011e500;
          }
          if (uVar3 != 0x2f00) {
            if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
            goto LAB_0011e500;
          }
          goto switchD_0011d89b_caseD_22;
        }
        if (uVar3 < 0x2e00) {
          if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
          if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
          goto LAB_0011e500;
        }
        if (uVar3 != 0x2e00) {
          if (uVar3 != 0x2e80) goto LAB_0011e500;
          goto switchD_0011d89b_caseD_21;
        }
        goto switchD_0011d89b_caseD_20;
      }
      if (0x3d7f < uVar3) {
        if (uVar3 < 0x3f80) {
          if (uVar3 < 16000) {
            if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
            if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          }
          else {
            if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
            if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          }
          goto LAB_0011e500;
        }
        if (uVar3 < 0x4100) {
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
          if (uVar3 != 0x4080) goto LAB_0011e500;
          goto switchD_0011d89b_caseD_45;
        }
        if (uVar3 == 0x4100) goto switchD_0011e416_caseD_0;
        if (uVar3 != 0x4180) goto LAB_0011e500;
        goto switchD_0011e416_caseD_1;
      }
      if (uVar3 < 0x3b80) {
        if (uVar3 < 0x3a80) {
          if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
          if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
        }
        else {
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
          if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
        }
      }
      else if (uVar3 < 0x3c80) {
        if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
        if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
      }
      else {
        if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
        if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
      }
LAB_0011e500:
      switch(uVar3 - 0x4200 >> 7) {
      case 0:
        goto switchD_0011e522_caseD_0;
      case 1:
        goto switchD_0011e55a_caseD_0;
      case 2:
        goto switchD_0011e55a_caseD_1;
      case 3:
        goto switchD_0011e55a_caseD_2;
      case 4:
        goto switchD_0011e55a_caseD_3;
      case 5:
        goto switchD_0011e55a_caseD_4;
      case 6:
        goto switchD_0011e522_caseD_6;
      case 7:
        goto switchD_0011e522_caseD_7;
      default:
        goto switchD_0011e522_default;
      }
    }
    if (uVar3 < 0x4d80) {
      if (uVar3 != 0x4c80) {
        if (uVar3 != 0x4d00) goto LAB_0011e269;
        goto switchD_0011b75c_caseD_1;
      }
switchD_0011b75c_caseD_0:
      snprintf(buf,buflen,"ECP - Invalid private or public key");
switchD_0011b75c_default:
      if (uVar3 < 0x3c00) {
        if (uVar3 < 0x1480) {
          if (uVar3 < 0x1280) {
            if (uVar3 < 0x1180) {
              if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
              if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
            }
            else {
              if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
              if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
            }
          }
          else if (uVar3 < 0x1380) {
            if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
            if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
          }
          else {
            if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
            if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
          }
        }
        else if (uVar3 < 0x3a00) {
          if (uVar3 < 0x3900) {
            if (uVar3 == 0x1480) goto LAB_0011d5c6;
            if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
          }
          else {
            if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
            if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
          }
        }
        else if (uVar3 < 0x3b00) {
          if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
        }
        else {
          if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
          if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
        }
      }
      else if (uVar3 < 0x4b00) {
        if (uVar3 < 0x3e00) {
          if (uVar3 < 0x3d00) {
            if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
            if (uVar3 == 0x3c80) goto switchD_0011d5fc_caseD_0;
          }
          else {
            if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
            if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
          }
        }
        else if (uVar3 < 0x3f00) {
          if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
          if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        }
        else {
          if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
          if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
        }
      }
      else if (uVar3 < 0x5100) {
        if (uVar3 < 0x4c00) {
          if (uVar3 == 0x4b00) goto LAB_0011c45b;
          if (uVar3 == 0x4b80) goto LAB_0011c3a8;
        }
        else {
          if (uVar3 == 0x4c00) goto LAB_0011c357;
          if (uVar3 == 0x5080) goto LAB_0011c51a;
        }
      }
      else if (uVar3 < 0x5200) {
        if (uVar3 == 0x5100) goto LAB_0011c600;
        if (uVar3 == 0x5180) goto LAB_0011c670;
      }
      else {
        if (uVar3 == 0x5200) goto LAB_0011c8bf;
        if (uVar3 == 0x5280) goto LAB_0011c946;
      }
      goto LAB_0011df8c;
    }
    if (uVar3 != 0x4d80) {
      if (uVar3 != 0x4e00) goto LAB_0011e269;
      goto switchD_0011b75c_caseD_3;
    }
switchD_0011b75c_caseD_2:
    snprintf(buf,buflen,"ECP - Memory allocation failed");
LAB_0011bc47:
    if (uVar3 < 16000) {
      if (uVar3 < 0x1380) {
        if (uVar3 < 0x1200) {
          if (uVar3 == 0x1080) goto switchD_0011c97c_caseD_0;
          if (uVar3 == 0x1100) goto switchD_0011c97c_caseD_1;
          if (uVar3 == 0x1180) goto switchD_0011cc10_caseD_0;
        }
        else {
          if (uVar3 == 0x1200) goto switchD_0011cc10_caseD_1;
          if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
          if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
        }
      }
      else if (uVar3 < 0x3d00) {
        if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
        if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
        if (uVar3 == 0x1480) goto LAB_0011d5c6;
      }
      else {
        if (uVar3 == 0x3d00) goto switchD_0011d5fc_caseD_1;
        if (uVar3 == 0x3d80) goto switchD_0011d5fc_caseD_2;
        if (uVar3 == 0x3e00) goto switchD_0011d5fc_caseD_3;
      }
    }
    else if (uVar3 < 0x4c80) {
      if (uVar3 < 0x4b00) {
        if (uVar3 == 16000) goto switchD_0011d5fc_caseD_4;
        if (uVar3 == 0x3f00) goto switchD_0011d5fc_caseD_5;
        if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
      }
      else {
        if (uVar3 == 0x4b00) goto LAB_0011c45b;
        if (uVar3 == 0x4b80) goto LAB_0011c3a8;
        if (uVar3 == 0x4c00) goto LAB_0011c357;
      }
    }
    else if (uVar3 < 0x5100) {
      if (uVar3 == 0x4c80) goto switchD_0011b75c_caseD_0;
      if (uVar3 == 0x4d00) goto switchD_0011b75c_caseD_1;
      if (uVar3 == 0x5080) goto LAB_0011c51a;
    }
    else if (uVar3 < 0x5200) {
      if (uVar3 == 0x5100) goto LAB_0011c600;
      if (uVar3 == 0x5180) goto LAB_0011c670;
    }
    else {
      if (uVar3 == 0x5200) goto LAB_0011c8bf;
      if (uVar3 == 0x5280) goto LAB_0011c946;
    }
LAB_0011daa7:
    if (uVar3 < 0x3b80) {
LAB_0011dab0:
      if (uVar3 < 0x2f80) goto LAB_0011dabd;
      if (0x397f < uVar3) {
        if (0x3a7f < uVar3) {
          if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
          if (uVar3 == 0x3b00) goto switchD_0011dbad_caseD_4;
          goto switchD_0011e522_default;
        }
        goto LAB_0011dd8b;
      }
LAB_0011dd52:
      if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
      if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
      if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
      goto switchD_0011e522_default;
    }
    if (uVar3 < 0x4280) {
      if (uVar3 < 0x4080) goto LAB_0011daf6;
      goto LAB_0011e27b;
    }
LAB_0011e2d1:
    if (uVar3 < 0x4400) {
      if (uVar3 != 0x4280) {
LAB_0011e306:
        if (uVar3 != 0x4300) {
          if (uVar3 != 0x4380) goto switchD_0011e522_default;
          goto switchD_0011e55a_caseD_2;
        }
        goto switchD_0011e55a_caseD_1;
      }
      goto switchD_0011e55a_caseD_0;
    }
LAB_0011e2da:
    if (0x44ff < uVar3) goto LAB_0011e45a;
    if (uVar3 == 0x4400) goto switchD_0011e55a_caseD_3;
    goto LAB_0011e62a;
  }
  if (uVar3 < 0x3d80) {
    if (0x3c7f < uVar3) {
      if (uVar3 != 0x3c80) {
        if (uVar3 != 0x3d00) goto LAB_0011e269;
switchD_0011d5fc_caseD_1:
        snprintf(buf,buflen,"PK - Invalid key tag or value");
        goto LAB_0011daa7;
      }
switchD_0011d5fc_caseD_0:
      snprintf(buf,buflen,"PK - Key algorithm is unsupported (only RSA and EC are supported)");
switchD_0011d5fc_default:
      if (uVar3 < 0x3b00) {
        if (0x2eff < uVar3) {
          if (0x38ff < uVar3) {
            if (uVar3 < 0x3a00) goto LAB_0011dc2d;
            goto LAB_0011ddaa;
          }
          goto LAB_0011dd14;
        }
        goto LAB_0011dca6;
      }
      if (0x427f < uVar3) goto LAB_0011e2d1;
      if (uVar3 < 0x4080) goto LAB_0011db54;
LAB_0011e27b:
      if (uVar3 < 0x4180) goto LAB_0011e38d;
LAB_0011e49d:
      if (uVar3 == 0x4180) goto switchD_0011e416_caseD_1;
      if (uVar3 != 0x4200) goto switchD_0011e522_default;
      goto switchD_0011e522_caseD_0;
    }
    if (uVar3 != 0x3b80) {
      if (uVar3 != 0x3c00) goto LAB_0011e269;
switchD_0011d95f_caseD_2:
      snprintf(buf,buflen,"PK - Private key password can\'t be empty");
      switch(uVar3 - 0x3900 >> 7) {
      case 0:
        goto switchD_0011dbad_caseD_0;
      case 1:
        goto switchD_0011dbad_caseD_1;
      case 2:
        goto switchD_0011dbad_caseD_2;
      case 3:
        goto switchD_0011dbad_caseD_3;
      case 4:
        goto switchD_0011dbad_caseD_4;
      case 5:
        goto switchD_0011dbad_caseD_5;
      }
switchD_0011dbad_default:
      if (uVar3 < 0x4100) {
        if (uVar3 < 0x2e80) {
          if (uVar3 < 0x1f00) goto LAB_0011e0a6;
          if (uVar3 != 0x1f00) goto LAB_0011df20;
          goto switchD_0011d89b_caseD_2;
        }
        if (uVar3 < 0x2f80) goto LAB_0011e29a;
        if (uVar3 != 0x2f80) {
          if (uVar3 != 0x3880) goto LAB_0011e344;
          goto switchD_0011d89b_caseD_35;
        }
        goto switchD_0011d89b_caseD_23;
      }
      goto LAB_0011df95;
    }
switchD_0011dbad_caseD_5:
    snprintf(buf,buflen,"PK - Given private key password does not allow for correct decryption");
switchD_0011d927_default:
    if (uVar3 < 0x3a80) goto LAB_0011dc9d;
    if (0x427f < uVar3) goto LAB_0011e2d1;
    if (uVar3 < 0x4100) {
      if (uVar3 == 0x3a80) goto switchD_0011dbad_caseD_3;
      if (uVar3 != 0x3b00) goto LAB_0011e344;
      goto switchD_0011dbad_caseD_4;
    }
LAB_0011e494:
    if (uVar3 != 0x4100) goto LAB_0011e49d;
switchD_0011e416_caseD_0:
    snprintf(buf,buflen,"RSA - Input data contains invalid padding and is rejected");
    uVar1 = uVar3 - 0x4180 >> 7;
    if (uVar1 < 5) {
      (*(code *)(&DAT_00139e64 + *(int *)(&DAT_00139e64 + (ulong)uVar1 * 4)))();
      return;
    }
LAB_0011e5e0:
    switch(uVar3 - 0x4400 >> 7) {
    case 0:
      goto switchD_0011e55a_caseD_3;
    case 1:
      goto switchD_0011e55a_caseD_4;
    case 2:
      goto switchD_0011e522_caseD_6;
    case 3:
      goto switchD_0011e522_caseD_7;
    default:
      goto switchD_0011e522_default;
    }
  }
  if (uVar3 < 16000) {
    if (uVar3 != 0x3d80) {
      if (uVar3 != 0x3e00) goto LAB_0011e269;
switchD_0011d5fc_caseD_3:
      snprintf(buf,buflen,"PK - Read/write of file failed");
      goto LAB_0011d975;
    }
switchD_0011d5fc_caseD_2:
    snprintf(buf,buflen,"PK - Unsupported key version");
LAB_0011da5a:
    if (uVar3 < 0x3b80) goto LAB_0011dab0;
    if (0x41ff < uVar3) goto LAB_0011e148;
    if (0x3cff < uVar3) {
      if (0x40ff < uVar3) goto LAB_0011e213;
      if (uVar3 != 0x3d00) goto LAB_0011e344;
      goto switchD_0011d5fc_caseD_1;
    }
LAB_0011daf6:
    if (uVar3 == 0x3b80) goto switchD_0011dbad_caseD_5;
    if (uVar3 == 0x3c00) goto switchD_0011d95f_caseD_2;
    if (uVar3 != 0x3c80) goto switchD_0011e522_default;
    goto switchD_0011d5fc_caseD_0;
  }
  if (uVar3 != 16000) {
    if (uVar3 != 0x3f00) goto LAB_0011e269;
switchD_0011d5fc_caseD_5:
    snprintf(buf,buflen,"PK - Type mismatch, eg attempt to encrypt with an ECDSA key");
    switch(uVar3 - 0x3b80 >> 7) {
    case 0:
      goto switchD_0011dbad_caseD_5;
    case 1:
      goto switchD_0011d95f_caseD_2;
    case 2:
      goto switchD_0011d5fc_caseD_0;
    case 3:
      goto switchD_0011d5fc_caseD_1;
    case 4:
      goto switchD_0011d5fc_caseD_2;
    case 5:
      goto switchD_0011d5fc_caseD_3;
    case 6:
      goto switchD_0011d5fc_caseD_4;
    }
    goto switchD_0011d927_default;
  }
switchD_0011d5fc_caseD_4:
  snprintf(buf,buflen,"PK - Bad input parameters to function");
  switch(uVar3 - 0x3b00 >> 7) {
  case 0:
    goto switchD_0011dbad_caseD_4;
  case 1:
    goto switchD_0011dbad_caseD_5;
  case 2:
    goto switchD_0011d95f_caseD_2;
  case 3:
    goto switchD_0011d5fc_caseD_0;
  case 4:
    goto switchD_0011d5fc_caseD_1;
  case 5:
    goto switchD_0011d5fc_caseD_2;
  case 6:
    goto switchD_0011d5fc_caseD_3;
  }
switchD_0011d95f_default:
  if (uVar3 < 0x3a80) {
LAB_0011dc9d:
    if (0x2eff < uVar3) {
      if (0x38ff < uVar3) {
        if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
LAB_0011dd8b:
        if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
        if (uVar3 == 0x3a00) goto switchD_0011dbad_caseD_2;
        goto switchD_0011e522_default;
      }
LAB_0011dd14:
      if (uVar3 != 0x2f00) goto LAB_0011dd21;
      goto switchD_0011d89b_caseD_22;
    }
LAB_0011dca6:
    if (uVar3 < 0x1f80) {
LAB_0011dcb3:
      if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
      if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
      if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
      goto switchD_0011e522_default;
    }
    if (uVar3 == 0x1f80) goto switchD_0011d89b_caseD_3;
LAB_0011e0c1:
    if (uVar3 == 0x2e00) goto switchD_0011d89b_caseD_20;
    if (uVar3 == 0x2e80) goto switchD_0011d89b_caseD_21;
    goto switchD_0011e522_default;
  }
  if (0x42ff < uVar3) goto LAB_0011e418;
  if (uVar3 < 0x4180) {
    if (uVar3 != 0x3a80) goto LAB_0011e38d;
    goto switchD_0011dbad_caseD_3;
  }
LAB_0011e46c:
  if (uVar3 == 0x4180) {
switchD_0011e416_caseD_1:
    snprintf(buf,buflen,"RSA - Something failed during generation of a key");
    goto LAB_0011e500;
  }
LAB_0011e475:
  if (uVar3 != 0x4200) {
    if (uVar3 != 0x4280) goto switchD_0011e522_default;
    goto switchD_0011e55a_caseD_0;
  }
switchD_0011e522_caseD_0:
  snprintf(buf,buflen,"RSA - Key failed to pass the validity check of the library");
  switch(uVar3 - 0x4280 >> 7) {
  case 0:
switchD_0011e55a_caseD_0:
    snprintf(buf,buflen,"RSA - The public key operation failed");
    goto LAB_0011e570;
  case 1:
switchD_0011e55a_caseD_1:
    snprintf(buf,buflen,"RSA - The private key operation failed");
    goto LAB_0011e5a8;
  case 2:
switchD_0011e55a_caseD_2:
    snprintf(buf,buflen,"RSA - The PKCS#1 verification failed");
    goto LAB_0011e5e0;
  case 3:
    goto switchD_0011e55a_caseD_3;
  case 4:
    goto switchD_0011e55a_caseD_4;
  }
switchD_0011e55a_default:
  if (uVar3 != 0x4580) {
    if (uVar3 == 0x4500) goto switchD_0011e522_caseD_6;
    goto switchD_0011e522_default;
  }
switchD_0011e522_caseD_7:
  snprintf(buf,buflen,"RSA - RSA hardware accelerator failed");
  goto switchD_0011e522_default;
switchD_0011cc10_caseD_1:
  snprintf(buf,buflen,"PEM - RSA IV is not in hex-format");
  if (uVar3 < 0x1400) {
    if (uVar3 == 0x1280) goto switchD_0011cc10_caseD_2;
    if (uVar3 == 0x1300) goto switchD_0011cc10_caseD_3;
    if (uVar3 == 0x1380) goto switchD_0011cc10_caseD_4;
  }
  else {
    if (uVar3 == 0x1400) goto switchD_0011cc10_caseD_5;
    if (uVar3 == 0x1480) goto LAB_0011d5c6;
    if (uVar3 == 0x3f80) goto switchD_0011d5fc_caseD_6;
  }
LAB_0011d879:
  switch(uVar3 - 0x1e00 >> 7) {
  case 0:
    goto switchD_0011d89b_caseD_0;
  case 2:
    goto switchD_0011d89b_caseD_2;
  case 3:
switchD_0011d89b_caseD_3:
    snprintf(buf,buflen,"PKCS12 - Bad input parameters to function");
    if (uVar3 < 0x1f00) {
      if (uVar3 == 0x1e00) goto switchD_0011d89b_caseD_0;
      if (uVar3 == 0x1e80) goto switchD_0011d89b_caseD_1;
    }
    else {
      if (uVar3 == 0x2f80) goto switchD_0011d89b_caseD_23;
      if (uVar3 == 0x2f00) goto switchD_0011d89b_caseD_22;
      if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
    }
    goto LAB_0011e2c8;
  default:
    goto switchD_0011d89b_caseD_4;
  case 0x20:
    goto switchD_0011d89b_caseD_20;
  case 0x21:
    goto switchD_0011d89b_caseD_21;
  case 0x22:
    goto switchD_0011d89b_caseD_22;
  case 0x23:
    goto switchD_0011d89b_caseD_23;
  case 0x35:
    goto switchD_0011d89b_caseD_35;
  case 0x36:
switchD_0011dbad_caseD_0:
    snprintf(buf,buflen,"PK - The buffer contains a valid signature followed by more data");
    goto switchD_0011dbad_default;
  case 0x37:
    goto switchD_0011dbad_caseD_1;
  case 0x38:
switchD_0011dbad_caseD_2:
    snprintf(buf,buflen,"PK - Elliptic curve is unsupported (only NIST curves are supported)");
    if (0x387f < uVar3) {
      if (uVar3 == 0x3880) goto switchD_0011d89b_caseD_35;
      if (uVar3 == 0x3900) goto switchD_0011dbad_caseD_0;
      if (uVar3 == 0x3980) goto switchD_0011dbad_caseD_1;
      break;
    }
    if (uVar3 != 0x1e80) {
      if (uVar3 == 0x1f00) goto switchD_0011d89b_caseD_2;
      if (uVar3 != 0x1f80) break;
      goto switchD_0011d89b_caseD_3;
    }
  case 1:
switchD_0011d89b_caseD_1:
    snprintf(buf,buflen,"PKCS12 - PBE ASN.1 data not as expected");
    break;
  case 0x39:
    goto switchD_0011dbad_caseD_3;
  case 0x3a:
switchD_0011dbad_caseD_4:
    snprintf(buf,buflen,"PK - The pubkey tag or value is invalid (only RSA and EC are supported)");
    goto switchD_0011d95f_default;
  case 0x3b:
    goto switchD_0011dbad_caseD_5;
  case 0x3c:
    goto switchD_0011d95f_caseD_2;
  case 0x3d:
    goto switchD_0011d5fc_caseD_0;
  case 0x3e:
    goto switchD_0011d5fc_caseD_1;
  case 0x3f:
    goto switchD_0011d5fc_caseD_2;
  case 0x40:
    goto switchD_0011d5fc_caseD_3;
  case 0x41:
    goto switchD_0011d5fc_caseD_4;
  case 0x42:
    goto switchD_0011d5fc_caseD_5;
  case 0x45:
    goto switchD_0011d89b_caseD_45;
  case 0x46:
    goto switchD_0011e416_caseD_0;
  case 0x47:
    goto switchD_0011e416_caseD_1;
  case 0x48:
    goto switchD_0011e522_caseD_0;
  case 0x49:
    goto switchD_0011e55a_caseD_0;
  case 0x4a:
    goto switchD_0011e55a_caseD_1;
  case 0x4b:
    goto switchD_0011e55a_caseD_2;
  case 0x4c:
    goto switchD_0011e55a_caseD_3;
  case 0x4d:
    goto switchD_0011e55a_caseD_4;
  case 0x4e:
    goto switchD_0011e522_caseD_6;
  }
  goto LAB_0011e10a;
switchD_0011e55a_caseD_4:
  snprintf(buf,buflen,"RSA - The random generator failed to generate non-zeros");
  goto switchD_0011e55a_default;
switchD_0011e70c_caseD_e:
  snprintf(buf,buflen,"BIGNUM - Memory allocation failed");
switchD_0011ebd9_caseD_1:
  if (uVar4 < 0x51) {
    switch(uVar4) {
    case 0x24:
      goto switchD_0011e70c_caseD_22;
    case 0x25:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x35:
    case 0x37:
    case 0x39:
    case 0x3b:
    case 0x3f:
      goto switchD_0011edbd_caseD_25;
    case 0x26:
      goto switchD_0011e70c_caseD_24;
    case 0x27:
      goto switchD_0011e70c_caseD_25;
    case 0x32:
      goto switchD_0011f497_caseD_32;
    case 0x33:
      goto switchD_0011f497_caseD_33;
    case 0x34:
      goto switchD_0011e70c_caseD_32;
    case 0x36:
      goto switchD_0011e70c_caseD_34;
    case 0x38:
      goto switchD_0011e70c_caseD_36;
    case 0x3a:
      goto switchD_0011e70c_caseD_38;
    case 0x3c:
      goto switchD_0011f497_caseD_3c;
    case 0x3d:
      goto switchD_0011f497_caseD_3d;
    case 0x3e:
      goto switchD_0011f497_caseD_3e;
    case 0x40:
      goto switchD_0011f497_caseD_40;
    default:
      switch(uVar4) {
      case 0xd:
        goto switchD_0011e70c_caseD_b;
      default:
        goto switchD_0011edbd_caseD_25;
      case 0xf:
        goto switchD_0011e70c_caseD_d;
      case 0x11:
        goto switchD_0011e70c_caseD_f;
      case 0x16:
switchD_0011e70c_caseD_14:
        snprintf(buf,buflen,"BLOWFISH - Bad input data");
        goto switchD_0011e744_caseD_1;
      case 0x17:
        goto switchD_0011e70c_caseD_15;
      case 0x18:
        goto switchD_0011e70c_caseD_16;
      }
    }
  }
  switch(uVar4) {
  case 0x51:
    goto switchD_0011e70c_caseD_4f;
  case 0x52:
    goto switchD_0011edbd_caseD_25;
  case 0x53:
    goto switchD_0011e70c_caseD_51;
  case 0x54:
    goto switchD_0011e70c_caseD_52;
  case 0x55:
    goto switchD_0011e70c_caseD_53;
  case 0x56:
    goto switchD_0011e70c_caseD_54;
  default:
    if (uVar4 != 0x7a) goto switchD_0011edbd_caseD_25;
  }
  goto switchD_0011f220_caseD_7a;
switchD_0011ff15_caseD_39:
  snprintf(buf,buflen,"SHA512 - SHA-512 hardware accelerator failed");
  if (uVar4 == 0x28) goto switchD_0011f92e_caseD_28;
  if (uVar4 != 0x29) {
LAB_0012008c:
    if (uVar4 != 0x75) goto switchD_0011ff15_caseD_32;
switchD_0011f645_caseD_75:
    snprintf(buf,buflen,"SHA512 - SHA-512 input data was malformed");
    if (uVar4 != 0x29) {
      if (uVar4 != 0x28) goto switchD_0011ff15_caseD_32;
      goto switchD_0011f92e_caseD_28;
    }
  }
  goto switchD_0011f92e_caseD_29;
switchD_0011f92e_caseD_28:
  snprintf(buf,buflen,"XTEA - The data input has an invalid length");
LAB_001200c6:
  if (uVar4 != 0x29) goto switchD_0011ff15_caseD_32;
switchD_0011f92e_caseD_29:
  snprintf(buf,buflen,"XTEA - XTEA hardware accelerator failed");
switchD_0011ff15_caseD_32:
  if (*buf != '\0') {
    return;
  }
  snprintf(buf,buflen,"UNKNOWN ERROR CODE (%04X)",(ulong)uVar4);
  return;
}

Assistant:

void mbedtls_strerror( int ret, char *buf, size_t buflen )
{
    size_t len;
    int use_ret;

    if( buflen == 0 )
        return;

    memset( buf, 0x00, buflen );

    if( ret < 0 )
        ret = -ret;

    if( ret & 0xFF80 )
    {
        use_ret = ret & 0xFF80;

        // High level error codes
        //
        // BEGIN generated code
#if defined(MBEDTLS_CIPHER_C)
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_FULL_BLOCK_EXPECTED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Decryption of block requires a full block" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_AUTH_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Authentication failed (for AEAD modes)" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_INVALID_CONTEXT) )
            mbedtls_snprintf( buf, buflen, "CIPHER - The context is invalid. For example, because it was freed" );
        if( use_ret == -(MBEDTLS_ERR_CIPHER_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "CIPHER - Cipher hardware accelerator failed" );
#endif /* MBEDTLS_CIPHER_C */

#if defined(MBEDTLS_DHM_C)
        if( use_ret == -(MBEDTLS_ERR_DHM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "DHM - Bad input parameters" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PARAMS_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the DHM parameters failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_READ_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Reading of the public values failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_MAKE_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Making of the public value failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_CALC_SECRET_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Calculation of the DHM secret failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "DHM - The ASN.1 data is not formatted correctly" );
        if( use_ret == -(MBEDTLS_ERR_DHM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Allocation of memory failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "DHM - Read or write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - DHM hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_DHM_SET_GROUP_FAILED) )
            mbedtls_snprintf( buf, buflen, "DHM - Setting the modulus and generator failed" );
#endif /* MBEDTLS_DHM_C */

#if defined(MBEDTLS_ECP_C)
        if( use_ret == -(MBEDTLS_ERR_ECP_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "ECP - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_ECP_BUFFER_TOO_SMALL) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer is too small to write to" );
        if( use_ret == -(MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "ECP - The requested feature is not available, for example, the requested curve is not supported" );
        if( use_ret == -(MBEDTLS_ERR_ECP_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The signature is not valid" );
        if( use_ret == -(MBEDTLS_ERR_ECP_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_RANDOM_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - Generation of random value, such as ephemeral key, failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_INVALID_KEY) )
            mbedtls_snprintf( buf, buflen, "ECP - Invalid private or public key" );
        if( use_ret == -(MBEDTLS_ERR_ECP_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "ECP - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_ECP_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "ECP - The ECP hardware accelerator failed" );
        if( use_ret == -(MBEDTLS_ERR_ECP_IN_PROGRESS) )
            mbedtls_snprintf( buf, buflen, "ECP - Operation in progress, call again with the same parameters to continue" );
#endif /* MBEDTLS_ECP_C */

#if defined(MBEDTLS_MD_C)
        if( use_ret == -(MBEDTLS_ERR_MD_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "MD - The selected feature is not available" );
        if( use_ret == -(MBEDTLS_ERR_MD_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "MD - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_MD_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_MD_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "MD - Opening or reading of file failed" );
        if( use_ret == -(MBEDTLS_ERR_MD_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "MD - MD hardware accelerator failed" );
#endif /* MBEDTLS_MD_C */

#if defined(MBEDTLS_PEM_PARSE_C) || defined(MBEDTLS_PEM_WRITE_C)
        if( use_ret == -(MBEDTLS_ERR_PEM_NO_HEADER_FOOTER_PRESENT) )
            mbedtls_snprintf( buf, buflen, "PEM - No PEM header or footer found" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - PEM string is not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PEM_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PEM - Failed to allocate memory" );
        if( use_ret == -(MBEDTLS_ERR_PEM_INVALID_ENC_IV) )
            mbedtls_snprintf( buf, buflen, "PEM - RSA IV is not in hex-format" );
        if( use_ret == -(MBEDTLS_ERR_PEM_UNKNOWN_ENC_ALG) )
            mbedtls_snprintf( buf, buflen, "PEM - Unsupported key encryption algorithm" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PEM - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PEM_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PEM - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PEM_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PEM - Unavailable feature, e.g. hashing/encryption combination" );
        if( use_ret == -(MBEDTLS_ERR_PEM_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PEM - Bad input parameters to function" );
#endif /* MBEDTLS_PEM_PARSE_C || MBEDTLS_PEM_WRITE_C */

#if defined(MBEDTLS_PK_C)
        if( use_ret == -(MBEDTLS_ERR_PK_ALLOC_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - Memory allocation failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_TYPE_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Type mismatch, eg attempt to encrypt with an ECDSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PK - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PK_FILE_IO_ERROR) )
            mbedtls_snprintf( buf, buflen, "PK - Read/write of file failed" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_VERSION) )
            mbedtls_snprintf( buf, buflen, "PK - Unsupported key version" );
        if( use_ret == -(MBEDTLS_ERR_PK_KEY_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PK - Invalid key tag or value" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_PK_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - Key algorithm is unsupported (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_REQUIRED) )
            mbedtls_snprintf( buf, buflen, "PK - Private key password can't be empty" );
        if( use_ret == -(MBEDTLS_ERR_PK_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - Given private key password does not allow for correct decryption" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_PUBKEY) )
            mbedtls_snprintf( buf, buflen, "PK - The pubkey tag or value is invalid (only RSA and EC are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_INVALID_ALG) )
            mbedtls_snprintf( buf, buflen, "PK - The algorithm tag or value is invalid" );
        if( use_ret == -(MBEDTLS_ERR_PK_UNKNOWN_NAMED_CURVE) )
            mbedtls_snprintf( buf, buflen, "PK - Elliptic curve is unsupported (only NIST curves are supported)" );
        if( use_ret == -(MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PK - Unavailable feature, e.g. RSA disabled for RSA key" );
        if( use_ret == -(MBEDTLS_ERR_PK_SIG_LEN_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PK - The buffer contains a valid signature followed by more data" );
        if( use_ret == -(MBEDTLS_ERR_PK_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "PK - PK hardware accelerator failed" );
#endif /* MBEDTLS_PK_C */

#if defined(MBEDTLS_PKCS12_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS12_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Feature not available, e.g. unsupported encryption scheme" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PBE_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - PBE ASN.1 data not as expected" );
        if( use_ret == -(MBEDTLS_ERR_PKCS12_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS12 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS12_C */

#if defined(MBEDTLS_PKCS5_C)
        if( use_ret == -(MBEDTLS_ERR_PKCS5_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_INVALID_FORMAT) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Unexpected ASN.1 data" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_FEATURE_UNAVAILABLE) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Requested encryption or digest alg not available" );
        if( use_ret == -(MBEDTLS_ERR_PKCS5_PASSWORD_MISMATCH) )
            mbedtls_snprintf( buf, buflen, "PKCS5 - Given private key password does not allow for correct decryption" );
#endif /* MBEDTLS_PKCS5_C */

#if defined(MBEDTLS_RSA_C)
        if( use_ret == -(MBEDTLS_ERR_RSA_BAD_INPUT_DATA) )
            mbedtls_snprintf( buf, buflen, "RSA - Bad input parameters to function" );
        if( use_ret == -(MBEDTLS_ERR_RSA_INVALID_PADDING) )
            mbedtls_snprintf( buf, buflen, "RSA - Input data contains invalid padding and is rejected" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_GEN_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Something failed during generation of a key" );
        if( use_ret == -(MBEDTLS_ERR_RSA_KEY_CHECK_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - Key failed to pass the validity check of the library" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PUBLIC_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The public key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_PRIVATE_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The private key operation failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_VERIFY_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The PKCS#1 verification failed" );
        if( use_ret == -(MBEDTLS_ERR_RSA_OUTPUT_TOO_LARGE) )
            mbedtls_snprintf( buf, buflen, "RSA - The output buffer for decryption is not large enough" );
        if( use_ret == -(MBEDTLS_ERR_RSA_RNG_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - The random generator failed to generate non-zeros" );
        if( use_ret == -(MBEDTLS_ERR_RSA_UNSUPPORTED_OPERATION) )
            mbedtls_snprintf( buf, buflen, "RSA - The implementation does not offer the requested operation, for example, because of security violations or lack of functionality" );
        if( use_ret == -(MBEDTLS_ERR_RSA_HW_ACCEL_FAILED) )
            mbedtls_snprintf( buf, buflen, "RSA - RSA hardware accelerator failed" );
#endif /* MBEDTLS_RSA_C */
        // END generated code

        if( strlen( buf ) == 0 )
            mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
    }

    use_ret = ret & ~0xFF80;

    if( use_ret == 0 )
        return;

    // If high level code is present, make a concatenation between both
    // error strings.
    //
    len = strlen( buf );

    if( len > 0 )
    {
        if( buflen - len < 5 )
            return;

        mbedtls_snprintf( buf + len, buflen - len, " : " );

        buf += len + 3;
        buflen -= len + 3;
    }

    // Low level error codes
    //
    // BEGIN generated code
#if defined(MBEDTLS_AES_C)
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_KEY_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid key length" );
    if( use_ret == -(MBEDTLS_ERR_AES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_AES_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "AES - Invalid input data" );
    if( use_ret == -(MBEDTLS_ERR_AES_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "AES - Feature not available. For example, an unsupported AES key size" );
    if( use_ret == -(MBEDTLS_ERR_AES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "AES - AES hardware accelerator failed" );
#endif /* MBEDTLS_AES_C */

#if defined(MBEDTLS_ARC4_C)
    if( use_ret == -(MBEDTLS_ERR_ARC4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARC4 - ARC4 hardware accelerator failed" );
#endif /* MBEDTLS_ARC4_C */

#if defined(MBEDTLS_ARIA_C)
    if( use_ret == -(MBEDTLS_ERR_ARIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "ARIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ARIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "ARIA - Feature not available. For example, an unsupported ARIA key size" );
    if( use_ret == -(MBEDTLS_ERR_ARIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "ARIA - ARIA hardware accelerator failed" );
#endif /* MBEDTLS_ARIA_C */

#if defined(MBEDTLS_ASN1_PARSE_C)
    if( use_ret == -(MBEDTLS_ERR_ASN1_OUT_OF_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Out of data when parsing an ASN1 data structure" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_UNEXPECTED_TAG) )
        mbedtls_snprintf( buf, buflen, "ASN1 - ASN1 tag was of an unexpected value" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_LENGTH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Error when trying to determine the length or invalid length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_LENGTH_MISMATCH) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Actual length differs from expected length" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_INVALID_DATA) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Data is invalid" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Memory allocation failed" );
    if( use_ret == -(MBEDTLS_ERR_ASN1_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "ASN1 - Buffer too small when writing ASN.1 data structure" );
#endif /* MBEDTLS_ASN1_PARSE_C */

#if defined(MBEDTLS_BASE64_C)
    if( use_ret == -(MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Output buffer too small" );
    if( use_ret == -(MBEDTLS_ERR_BASE64_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BASE64 - Invalid character in input" );
#endif /* MBEDTLS_BASE64_C */

#if defined(MBEDTLS_BIGNUM_C)
    if( use_ret == -(MBEDTLS_ERR_MPI_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - An error occurred while reading from or writing to a file" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_MPI_INVALID_CHARACTER) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - There is an invalid character in the digit string" );
    if( use_ret == -(MBEDTLS_ERR_MPI_BUFFER_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The buffer is too small to write to" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NEGATIVE_VALUE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are negative or result in illegal output" );
    if( use_ret == -(MBEDTLS_ERR_MPI_DIVISION_BY_ZERO) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input argument for division is zero, which is not allowed" );
    if( use_ret == -(MBEDTLS_ERR_MPI_NOT_ACCEPTABLE) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - The input arguments are not acceptable" );
    if( use_ret == -(MBEDTLS_ERR_MPI_ALLOC_FAILED) )
        mbedtls_snprintf( buf, buflen, "BIGNUM - Memory allocation failed" );
#endif /* MBEDTLS_BIGNUM_C */

#if defined(MBEDTLS_BLOWFISH_C)
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_BLOWFISH_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "BLOWFISH - Blowfish hardware accelerator failed" );
#endif /* MBEDTLS_BLOWFISH_C */

#if defined(MBEDTLS_CAMELLIA_C)
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Bad input data" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Invalid data input length" );
    if( use_ret == -(MBEDTLS_ERR_CAMELLIA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CAMELLIA - Camellia hardware accelerator failed" );
#endif /* MBEDTLS_CAMELLIA_C */

#if defined(MBEDTLS_CCM_C)
    if( use_ret == -(MBEDTLS_ERR_CCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "CCM - Bad input parameters to the function" );
    if( use_ret == -(MBEDTLS_ERR_CCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_CCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CCM - CCM hardware accelerator failed" );
#endif /* MBEDTLS_CCM_C */

#if defined(MBEDTLS_CHACHA20_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_CHACHA20_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHA20 - Chacha20 hardware accelerator failed" );
#endif /* MBEDTLS_CHACHA20_C */

#if defined(MBEDTLS_CHACHAPOLY_C)
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_BAD_STATE) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - The requested operation is not permitted in the current state" );
    if( use_ret == -(MBEDTLS_ERR_CHACHAPOLY_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "CHACHAPOLY - Authenticated decryption failed: data was not authentic" );
#endif /* MBEDTLS_CHACHAPOLY_C */

#if defined(MBEDTLS_CMAC_C)
    if( use_ret == -(MBEDTLS_ERR_CMAC_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "CMAC - CMAC hardware accelerator failed" );
#endif /* MBEDTLS_CMAC_C */

#if defined(MBEDTLS_CTR_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The entropy source failed" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The requested random buffer length is too big" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - The input (entropy + additional data) is too large" );
    if( use_ret == -(MBEDTLS_ERR_CTR_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "CTR_DRBG - Read or write error in file" );
#endif /* MBEDTLS_CTR_DRBG_C */

#if defined(MBEDTLS_DES_C)
    if( use_ret == -(MBEDTLS_ERR_DES_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "DES - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_DES_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "DES - DES hardware accelerator failed" );
#endif /* MBEDTLS_DES_C */

#if defined(MBEDTLS_ENTROPY_C)
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Critical entropy source failure" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_MAX_SOURCES) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No more sources can be added" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_SOURCES_DEFINED) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_NO_STRONG_SOURCE) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - No strong sources have been added to poll" );
    if( use_ret == -(MBEDTLS_ERR_ENTROPY_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "ENTROPY - Read/write error in file" );
#endif /* MBEDTLS_ENTROPY_C */

#if defined(MBEDTLS_ERROR_C)
    if( use_ret == -(MBEDTLS_ERR_ERROR_GENERIC_ERROR) )
        mbedtls_snprintf( buf, buflen, "ERROR - Generic error" );
    if( use_ret == -(MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED) )
        mbedtls_snprintf( buf, buflen, "ERROR - This is a bug in the library" );
#endif /* MBEDTLS_ERROR_C */

#if defined(MBEDTLS_GCM_C)
    if( use_ret == -(MBEDTLS_ERR_GCM_AUTH_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - Authenticated decryption failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "GCM - GCM hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_GCM_BAD_INPUT) )
        mbedtls_snprintf( buf, buflen, "GCM - Bad input parameters to function" );
#endif /* MBEDTLS_GCM_C */

#if defined(MBEDTLS_HKDF_C)
    if( use_ret == -(MBEDTLS_ERR_HKDF_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "HKDF - Bad input parameters to function" );
#endif /* MBEDTLS_HKDF_C */

#if defined(MBEDTLS_HMAC_DRBG_C)
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_REQUEST_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Too many random requested in single call" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Input too large (Entropy + additional)" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - Read/write error in file" );
    if( use_ret == -(MBEDTLS_ERR_HMAC_DRBG_ENTROPY_SOURCE_FAILED) )
        mbedtls_snprintf( buf, buflen, "HMAC_DRBG - The entropy source failed" );
#endif /* MBEDTLS_HMAC_DRBG_C */

#if defined(MBEDTLS_MD2_C)
    if( use_ret == -(MBEDTLS_ERR_MD2_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD2 - MD2 hardware accelerator failed" );
#endif /* MBEDTLS_MD2_C */

#if defined(MBEDTLS_MD4_C)
    if( use_ret == -(MBEDTLS_ERR_MD4_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD4 - MD4 hardware accelerator failed" );
#endif /* MBEDTLS_MD4_C */

#if defined(MBEDTLS_MD5_C)
    if( use_ret == -(MBEDTLS_ERR_MD5_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "MD5 - MD5 hardware accelerator failed" );
#endif /* MBEDTLS_MD5_C */

#if defined(MBEDTLS_OID_C)
    if( use_ret == -(MBEDTLS_ERR_OID_NOT_FOUND) )
        mbedtls_snprintf( buf, buflen, "OID - OID is not found" );
    if( use_ret == -(MBEDTLS_ERR_OID_BUF_TOO_SMALL) )
        mbedtls_snprintf( buf, buflen, "OID - output buffer is too small" );
#endif /* MBEDTLS_OID_C */

#if defined(MBEDTLS_PADLOCK_C)
    if( use_ret == -(MBEDTLS_ERR_PADLOCK_DATA_MISALIGNED) )
        mbedtls_snprintf( buf, buflen, "PADLOCK - Input data should be aligned" );
#endif /* MBEDTLS_PADLOCK_C */

#if defined(MBEDTLS_PLATFORM_C)
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - Hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_PLATFORM_FEATURE_UNSUPPORTED) )
        mbedtls_snprintf( buf, buflen, "PLATFORM - The requested feature is not supported by the platform" );
#endif /* MBEDTLS_PLATFORM_C */

#if defined(MBEDTLS_POLY1305_C)
    if( use_ret == -(MBEDTLS_ERR_POLY1305_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Invalid input parameter(s)" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Feature not available. For example, s part of the API is not implemented" );
    if( use_ret == -(MBEDTLS_ERR_POLY1305_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "POLY1305 - Poly1305 hardware accelerator failed" );
#endif /* MBEDTLS_POLY1305_C */

#if defined(MBEDTLS_RIPEMD160_C)
    if( use_ret == -(MBEDTLS_ERR_RIPEMD160_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "RIPEMD160 - RIPEMD160 hardware accelerator failed" );
#endif /* MBEDTLS_RIPEMD160_C */

#if defined(MBEDTLS_SHA1_C)
    if( use_ret == -(MBEDTLS_ERR_SHA1_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA1_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA1 - SHA-1 input data was malformed" );
#endif /* MBEDTLS_SHA1_C */

#if defined(MBEDTLS_SHA256_C)
    if( use_ret == -(MBEDTLS_ERR_SHA256_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA256_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA256 - SHA-256 input data was malformed" );
#endif /* MBEDTLS_SHA256_C */

#if defined(MBEDTLS_SHA512_C)
    if( use_ret == -(MBEDTLS_ERR_SHA512_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 hardware accelerator failed" );
    if( use_ret == -(MBEDTLS_ERR_SHA512_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "SHA512 - SHA-512 input data was malformed" );
#endif /* MBEDTLS_SHA512_C */

#if defined(MBEDTLS_THREADING_C)
    if( use_ret == -(MBEDTLS_ERR_THREADING_FEATURE_UNAVAILABLE) )
        mbedtls_snprintf( buf, buflen, "THREADING - The selected feature is not available" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_BAD_INPUT_DATA) )
        mbedtls_snprintf( buf, buflen, "THREADING - Bad input parameters to function" );
    if( use_ret == -(MBEDTLS_ERR_THREADING_MUTEX_ERROR) )
        mbedtls_snprintf( buf, buflen, "THREADING - Locking / unlocking / free failed with error code" );
#endif /* MBEDTLS_THREADING_C */

#if defined(MBEDTLS_XTEA_C)
    if( use_ret == -(MBEDTLS_ERR_XTEA_INVALID_INPUT_LENGTH) )
        mbedtls_snprintf( buf, buflen, "XTEA - The data input has an invalid length" );
    if( use_ret == -(MBEDTLS_ERR_XTEA_HW_ACCEL_FAILED) )
        mbedtls_snprintf( buf, buflen, "XTEA - XTEA hardware accelerator failed" );
#endif /* MBEDTLS_XTEA_C */
    // END generated code

    if( strlen( buf ) != 0 )
        return;

    mbedtls_snprintf( buf, buflen, "UNKNOWN ERROR CODE (%04X)", use_ret );
}